

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy2_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *iEnd;
  BYTE *iStart;
  undefined8 *puVar5;
  ulong *iLimit;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  BYTE *base_11;
  BYTE *pBVar10;
  U32 *pUVar11;
  U16 *pUVar12;
  ushort uVar13;
  undefined8 uVar14;
  long lVar15;
  seqStore_t *psVar16;
  U32 target;
  uint uVar17;
  int iVar18;
  ulong *puVar19;
  ulong uVar20;
  size_t sVar21;
  ulong *puVar22;
  BYTE *pBVar23;
  byte bVar24;
  byte bVar25;
  U32 UVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  BYTE *pBVar30;
  uint uVar31;
  BYTE *pBVar32;
  int iVar33;
  BYTE *base_6;
  seqDef *psVar34;
  U32 UVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  U32 *hashTable_3;
  uint uVar40;
  ulong uVar41;
  ulong *puVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  BYTE *base_10;
  BYTE *base_8;
  long lVar46;
  BYTE *base;
  ulong *puVar47;
  ulong *puVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  BYTE *pStart;
  BYTE *pStart_12;
  BYTE *pInLoopLimit;
  U32 maxDistance;
  BYTE *litLimit_w;
  ulong local_1d0;
  uint local_17c;
  ulong *local_168;
  uint local_134;
  ulong *local_108;
  uint auStack_c8 [34];
  uint *local_40;
  seqStore_t *local_38;
  char cVar58;
  undefined1 uVar85;
  char cVar86;
  undefined1 uVar87;
  char cVar88;
  undefined1 uVar89;
  char cVar90;
  
  iEnd = (ulong *)((long)src + srcSize);
  iLimit = (ulong *)((long)src + (srcSize - 0x10));
  base_11 = (ms->window).base;
  pBVar10 = (ms->window).dictBase;
  uVar8 = (ms->window).dictLimit;
  iStart = base_11 + uVar8;
  uVar9 = (ms->window).lowLimit;
  puVar47 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  uVar17 = (ms->cParams).minMatch;
  UVar35 = 6;
  if (uVar17 < 6) {
    UVar35 = uVar17;
  }
  uVar17 = (ms->cParams).windowLog;
  local_17c = *rep;
  local_134 = rep[1];
  local_40 = rep;
  local_38 = seqStore;
  ZSTD_row_fillHashCache
            (ms,base_11,5 - ((ms->cParams).searchLog < 5),UVar35,ms->nextToUpdate,(BYTE *)iLimit);
  local_108 = (ulong *)src;
  if (puVar47 < iLimit) {
    puVar19 = (ulong *)(pBVar10 + uVar8);
    uVar17 = 1 << ((byte)uVar17 & 0x1f);
    iVar18 = uVar8 - 1;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    puVar4 = iEnd + -4;
    do {
      iVar33 = (int)puVar47 - (int)base_11;
      iVar43 = iVar33 + 1;
      uVar40 = (ms->window).lowLimit;
      UVar35 = ms->loadedDictEnd;
      uVar27 = iVar43 - uVar17;
      if (iVar43 - uVar40 <= uVar17) {
        uVar27 = uVar40;
      }
      if (UVar35 != 0) {
        uVar27 = uVar40;
      }
      uVar44 = iVar43 - local_17c;
      pBVar30 = base_11;
      if (uVar44 < uVar8) {
        pBVar30 = pBVar10;
      }
      if (iVar18 - uVar44 < 3) {
LAB_006db0b5:
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        if (local_17c < (iVar33 - uVar27) + 1) {
          if (*(int *)((long)puVar47 + 1U) != *(int *)(pBVar30 + uVar44)) goto LAB_006db0b5;
          puVar42 = iEnd;
          if (uVar44 < uVar8) {
            puVar42 = puVar19;
          }
          sVar21 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar47 + 5),(BYTE *)((long)(pBVar30 + uVar44) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar42,iStart);
          uVar20 = sVar21 + 4;
        }
      }
      uVar27 = (ms->cParams).searchLog;
      uVar44 = (ms->cParams).minMatch;
      if (uVar27 < 5) {
        bVar24 = (byte)uVar27;
        if (uVar44 - 6 < 2) {
          pBVar30 = (ms->window).base;
          pBVar23 = (ms->window).dictBase;
          uVar41 = (long)puVar47 - (long)pBVar30;
          uVar44 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar31 = (uint)uVar41;
          uVar27 = uVar31 - uVar44;
          if (uVar31 - uVar40 <= uVar44) {
            uVar27 = uVar40;
          }
          uVar44 = (ms->window).dictLimit;
          pUVar11 = ms->hashTable;
          pUVar12 = ms->tagTable;
          if (UVar35 != 0) {
            uVar27 = uVar40;
          }
          uVar38 = (ulong)ms->nextToUpdate;
          bVar25 = 0x38 - (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar31) {
            do {
              uVar45 = (uint)uVar38 & 7;
              uVar40 = ms->hashCache[uVar45];
              ms->hashCache[uVar45] =
                   (U32)((ulong)(*(long *)(pBVar30 + uVar38 + 8) * -0x30e4432340650000) >>
                        (bVar25 & 0x3f));
              uVar39 = (ulong)(uVar40 >> 4 & 0xfffffff0);
              uVar45 = (byte)((char)pUVar12[uVar39] - 1) & 0xf;
              *(char *)(pUVar12 + uVar39) = (char)uVar45;
              *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar39 * 2) = (char)uVar40;
              pUVar11[uVar39 + uVar45] = (uint)uVar38;
              uVar38 = uVar38 + 1;
            } while (uVar38 < (uVar41 & 0xffffffff));
          }
          ms->nextToUpdate = uVar31;
          uVar40 = ms->hashCache[uVar31 & 7];
          ms->hashCache[uVar31 & 7] =
               (U32)((ulong)(*(long *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x30e4432340650000)
                    >> (bVar25 & 0x3f));
          uVar41 = (ulong)(uVar40 >> 4 & 0xfffffff0);
          bVar25 = (byte)pUVar12[uVar41];
          pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
          uVar89 = (undefined1)(uVar40 >> 0x18);
          uVar87 = (undefined1)(uVar40 >> 0x10);
          uVar85 = (undefined1)(uVar40 >> 8);
          auVar60._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40)) >>
                    0x20);
          auVar60[3] = uVar85;
          auVar60[2] = uVar85;
          auVar60[0] = (undefined1)uVar40;
          auVar60[1] = auVar60[0];
          auVar60._8_8_ = 0;
          auVar92 = pshuflw(auVar60,auVar60,0);
          cVar58 = auVar92[0];
          auVar61[0] = -(cVar58 == *pcVar6);
          cVar86 = auVar92[1];
          auVar61[1] = -(cVar86 == pcVar6[1]);
          cVar88 = auVar92[2];
          auVar61[2] = -(cVar88 == pcVar6[2]);
          cVar90 = auVar92[3];
          auVar61[3] = -(cVar90 == pcVar6[3]);
          auVar61[4] = -(cVar58 == pcVar6[4]);
          auVar61[5] = -(cVar86 == pcVar6[5]);
          auVar61[6] = -(cVar88 == pcVar6[6]);
          auVar61[7] = -(cVar90 == pcVar6[7]);
          auVar61[8] = -(cVar58 == pcVar6[8]);
          auVar61[9] = -(cVar86 == pcVar6[9]);
          auVar61[10] = -(cVar88 == pcVar6[10]);
          auVar61[0xb] = -(cVar90 == pcVar6[0xb]);
          auVar61[0xc] = -(cVar58 == pcVar6[0xc]);
          auVar61[0xd] = -(cVar86 == pcVar6[0xd]);
          auVar61[0xe] = -(cVar88 == pcVar6[0xe]);
          auVar61[0xf] = -(cVar90 == pcVar6[0xf]);
          uVar13 = (ushort)(SUB161(auVar61 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar61 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar61 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar61 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar61 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar61 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar61 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar61 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar61 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar61 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar61 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar61 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar61 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar61[0xf] >> 7) << 0xf;
          uVar40 = (uint)uVar13;
          if ((bVar25 & 0xf) != 0) {
            uVar40 = (uint)uVar13 << (0x10 - (bVar25 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar13 >> (bVar25 & 0xf));
          }
          if (uVar40 == 0) {
            lVar37 = 0;
          }
          else {
            lVar46 = 0;
            while( true ) {
              iVar43 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                }
              }
              lVar37 = lVar46;
              if (pUVar11[uVar41 + (iVar43 + (uint)bVar25 & 0xf)] < uVar27) break;
              lVar37 = lVar46 + 1;
              auStack_c8[lVar46] = pUVar11[uVar41 + (iVar43 + (uint)bVar25 & 0xf)];
              uVar40 = uVar40 & uVar40 - 1;
              if ((uVar40 == 0) ||
                 (iVar43 = (int)lVar46, lVar46 = lVar37, (int)(1L << (bVar24 & 0x3f)) + -1 == iVar43
                 )) break;
            }
          }
          uVar40 = bVar25 - 1 & 0xf;
          *(char *)(pUVar12 + uVar41) = (char)uVar40;
          *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar60[0];
          UVar35 = ms->nextToUpdate;
          ms->nextToUpdate = UVar35 + 1;
          pUVar11[uVar41 + uVar40] = UVar35;
          if (lVar37 == 0) goto LAB_006dc7c4;
          local_1d0 = 999999999;
          lVar46 = 0;
          uVar41 = 3;
          do {
            uVar40 = auStack_c8[lVar46];
            uVar38 = (ulong)uVar40;
            if (uVar40 < uVar44) {
              if (*(int *)(pBVar23 + uVar38) == (int)*puVar47) {
                sVar21 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar47 + 4),pBVar23 + uVar38 + 4,(BYTE *)iEnd,
                                    pBVar23 + uVar44,pBVar30 + uVar44);
                uVar38 = sVar21 + 4;
LAB_006dbfe3:
                if ((uVar41 < uVar38) &&
                   (local_1d0 = (ulong)((uVar31 + 2) - uVar40), uVar41 = uVar38,
                   (ulong *)((long)puVar47 + uVar38) == iEnd)) break;
              }
            }
            else {
              puVar42 = (ulong *)(pBVar30 + uVar38);
              if (*(BYTE *)(uVar41 + (long)puVar42) == *(BYTE *)((long)puVar47 + uVar41)) {
                puVar22 = puVar47;
                if (puVar47 < puVar1) {
                  if (*puVar42 == *puVar47) {
                    lVar29 = 0;
                    do {
                      puVar22 = (ulong *)((long)puVar47 + lVar29 + 8);
                      if (puVar1 <= puVar22) {
                        puVar42 = (ulong *)(pBVar30 + lVar29 + uVar38 + 8);
                        goto LAB_006dbf91;
                      }
                      lVar15 = lVar29 + uVar38 + 8;
                      lVar29 = lVar29 + 8;
                    } while (*(ulong *)(pBVar30 + lVar15) == *puVar22);
                    uVar39 = *puVar22 ^ *(ulong *)(pBVar30 + lVar15);
                    uVar38 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar29;
                  }
                  else {
                    uVar39 = *puVar47 ^ *puVar42;
                    uVar38 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = uVar38 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_006dbf91:
                  if ((puVar22 < puVar2) && ((int)*puVar42 == (int)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 4);
                    puVar42 = (ulong *)((long)puVar42 + 4);
                  }
                  if ((puVar22 < puVar3) && ((short)*puVar42 == (short)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 2);
                    puVar42 = (ulong *)((long)puVar42 + 2);
                  }
                  if (puVar22 < iEnd) {
                    puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar22));
                  }
                  uVar38 = (long)puVar22 - (long)puVar47;
                }
                goto LAB_006dbfe3;
              }
            }
            uVar38 = uVar41;
            lVar46 = lVar46 + 1;
            uVar41 = uVar38;
          } while (lVar46 != lVar37);
        }
        else if (uVar44 == 5) {
          pBVar30 = (ms->window).base;
          pBVar23 = (ms->window).dictBase;
          uVar41 = (long)puVar47 - (long)pBVar30;
          uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar44 = (uint)uVar41;
          uVar27 = uVar44 - uVar31;
          if (uVar44 - uVar40 <= uVar31) {
            uVar27 = uVar40;
          }
          uVar31 = (ms->window).dictLimit;
          pUVar11 = ms->hashTable;
          pUVar12 = ms->tagTable;
          if (UVar35 != 0) {
            uVar27 = uVar40;
          }
          uVar38 = (ulong)ms->nextToUpdate;
          bVar25 = 0x38 - (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar44) {
            do {
              uVar45 = (uint)uVar38 & 7;
              uVar40 = ms->hashCache[uVar45];
              ms->hashCache[uVar45] =
                   (U32)((ulong)(*(long *)(pBVar30 + uVar38 + 8) * -0x30e4432345000000) >>
                        (bVar25 & 0x3f));
              uVar39 = (ulong)(uVar40 >> 4 & 0xfffffff0);
              uVar45 = (byte)((char)pUVar12[uVar39] - 1) & 0xf;
              *(char *)(pUVar12 + uVar39) = (char)uVar45;
              *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar39 * 2) = (char)uVar40;
              pUVar11[uVar39 + uVar45] = (uint)uVar38;
              uVar38 = uVar38 + 1;
            } while (uVar38 < (uVar41 & 0xffffffff));
          }
          ms->nextToUpdate = uVar44;
          uVar40 = ms->hashCache[uVar44 & 7];
          ms->hashCache[uVar44 & 7] =
               (U32)((ulong)(*(long *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x30e4432345000000)
                    >> (bVar25 & 0x3f));
          uVar41 = (ulong)(uVar40 >> 4 & 0xfffffff0);
          bVar25 = (byte)pUVar12[uVar41];
          pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
          uVar89 = (undefined1)(uVar40 >> 0x18);
          uVar87 = (undefined1)(uVar40 >> 0x10);
          uVar85 = (undefined1)(uVar40 >> 8);
          auVar65._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40)) >>
                    0x20);
          auVar65[3] = uVar85;
          auVar65[2] = uVar85;
          auVar65[0] = (undefined1)uVar40;
          auVar65[1] = auVar65[0];
          auVar65._8_8_ = 0;
          auVar92 = pshuflw(auVar65,auVar65,0);
          cVar58 = auVar92[0];
          auVar63[0] = -(cVar58 == *pcVar6);
          cVar86 = auVar92[1];
          auVar63[1] = -(cVar86 == pcVar6[1]);
          cVar88 = auVar92[2];
          auVar63[2] = -(cVar88 == pcVar6[2]);
          cVar90 = auVar92[3];
          auVar63[3] = -(cVar90 == pcVar6[3]);
          auVar63[4] = -(cVar58 == pcVar6[4]);
          auVar63[5] = -(cVar86 == pcVar6[5]);
          auVar63[6] = -(cVar88 == pcVar6[6]);
          auVar63[7] = -(cVar90 == pcVar6[7]);
          auVar63[8] = -(cVar58 == pcVar6[8]);
          auVar63[9] = -(cVar86 == pcVar6[9]);
          auVar63[10] = -(cVar88 == pcVar6[10]);
          auVar63[0xb] = -(cVar90 == pcVar6[0xb]);
          auVar63[0xc] = -(cVar58 == pcVar6[0xc]);
          auVar63[0xd] = -(cVar86 == pcVar6[0xd]);
          auVar63[0xe] = -(cVar88 == pcVar6[0xe]);
          auVar63[0xf] = -(cVar90 == pcVar6[0xf]);
          uVar13 = (ushort)(SUB161(auVar63 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar63[0xf] >> 7) << 0xf;
          uVar40 = (uint)uVar13;
          if ((bVar25 & 0xf) != 0) {
            uVar40 = (uint)uVar13 << (0x10 - (bVar25 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar13 >> (bVar25 & 0xf));
          }
          if (uVar40 == 0) {
            lVar37 = 0;
          }
          else {
            lVar46 = 0;
            while( true ) {
              iVar43 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                }
              }
              lVar37 = lVar46;
              if (pUVar11[uVar41 + (iVar43 + (uint)bVar25 & 0xf)] < uVar27) break;
              lVar37 = lVar46 + 1;
              auStack_c8[lVar46] = pUVar11[uVar41 + (iVar43 + (uint)bVar25 & 0xf)];
              uVar40 = uVar40 & uVar40 - 1;
              if ((uVar40 == 0) ||
                 (iVar43 = (int)lVar46, lVar46 = lVar37, (1 << (bVar24 & 0x1f)) + -1 == iVar43))
              break;
            }
          }
          uVar40 = bVar25 - 1 & 0xf;
          *(char *)(pUVar12 + uVar41) = (char)uVar40;
          *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar65[0];
          UVar35 = ms->nextToUpdate;
          ms->nextToUpdate = UVar35 + 1;
          pUVar11[uVar41 + uVar40] = UVar35;
          if (lVar37 == 0) goto LAB_006dc7c4;
          local_1d0 = 999999999;
          lVar46 = 0;
          uVar41 = 3;
          do {
            uVar40 = auStack_c8[lVar46];
            uVar38 = (ulong)uVar40;
            if (uVar40 < uVar31) {
              if (*(int *)(pBVar23 + uVar38) == (int)*puVar47) {
                sVar21 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar47 + 4),pBVar23 + uVar38 + 4,(BYTE *)iEnd,
                                    pBVar23 + uVar31,pBVar30 + uVar31);
                uVar38 = sVar21 + 4;
LAB_006dc3da:
                if ((uVar41 < uVar38) &&
                   (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar38,
                   (ulong *)((long)puVar47 + uVar38) == iEnd)) break;
              }
            }
            else {
              puVar42 = (ulong *)(pBVar30 + uVar38);
              if (*(BYTE *)(uVar41 + (long)puVar42) == *(BYTE *)((long)puVar47 + uVar41)) {
                puVar22 = puVar47;
                if (puVar47 < puVar1) {
                  if (*puVar42 == *puVar47) {
                    lVar29 = 0;
                    do {
                      puVar22 = (ulong *)((long)puVar47 + lVar29 + 8);
                      if (puVar1 <= puVar22) {
                        puVar42 = (ulong *)(pBVar30 + lVar29 + uVar38 + 8);
                        goto LAB_006dc397;
                      }
                      lVar15 = lVar29 + uVar38 + 8;
                      lVar29 = lVar29 + 8;
                    } while (*(ulong *)(pBVar30 + lVar15) == *puVar22);
                    uVar39 = *puVar22 ^ *(ulong *)(pBVar30 + lVar15);
                    uVar38 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar29;
                  }
                  else {
                    uVar39 = *puVar47 ^ *puVar42;
                    uVar38 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = uVar38 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_006dc397:
                  if ((puVar22 < puVar2) && ((int)*puVar42 == (int)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 4);
                    puVar42 = (ulong *)((long)puVar42 + 4);
                  }
                  if ((puVar22 < puVar3) && ((short)*puVar42 == (short)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 2);
                    puVar42 = (ulong *)((long)puVar42 + 2);
                  }
                  if (puVar22 < iEnd) {
                    puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar22));
                  }
                  uVar38 = (long)puVar22 - (long)puVar47;
                }
                goto LAB_006dc3da;
              }
            }
            uVar38 = uVar41;
            lVar46 = lVar46 + 1;
            uVar41 = uVar38;
          } while (lVar46 != lVar37);
        }
        else {
          pBVar30 = (ms->window).base;
          pBVar23 = (ms->window).dictBase;
          uVar41 = (long)puVar47 - (long)pBVar30;
          uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar44 = (uint)uVar41;
          uVar27 = uVar44 - uVar31;
          if (uVar44 - uVar40 <= uVar31) {
            uVar27 = uVar40;
          }
          uVar31 = (ms->window).dictLimit;
          pUVar11 = ms->hashTable;
          pUVar12 = ms->tagTable;
          if (UVar35 != 0) {
            uVar27 = uVar40;
          }
          uVar38 = (ulong)ms->nextToUpdate;
          bVar25 = 0x18 - (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar44) {
            do {
              uVar45 = (uint)uVar38 & 7;
              uVar40 = ms->hashCache[uVar45];
              ms->hashCache[uVar45] =
                   (uint)(*(int *)(pBVar30 + uVar38 + 8) * -0x61c8864f) >> (bVar25 & 0x1f);
              uVar39 = (ulong)(uVar40 >> 4 & 0xfffffff0);
              uVar45 = (byte)((char)pUVar12[uVar39] - 1) & 0xf;
              *(char *)(pUVar12 + uVar39) = (char)uVar45;
              *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar39 * 2) = (char)uVar40;
              pUVar11[uVar39 + uVar45] = (uint)uVar38;
              uVar38 = uVar38 + 1;
            } while (uVar38 < (uVar41 & 0xffffffff));
          }
          ms->nextToUpdate = uVar44;
          uVar40 = ms->hashCache[uVar44 & 7];
          ms->hashCache[uVar44 & 7] =
               (uint)(*(int *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x61c8864f) >>
               (bVar25 & 0x1f);
          uVar41 = (ulong)(uVar40 >> 4 & 0xfffffff0);
          bVar25 = (byte)pUVar12[uVar41];
          pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
          uVar89 = (undefined1)(uVar40 >> 0x18);
          uVar87 = (undefined1)(uVar40 >> 0x10);
          uVar85 = (undefined1)(uVar40 >> 8);
          auVar92._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40)) >>
                    0x20);
          auVar92[3] = uVar85;
          auVar92[2] = uVar85;
          auVar92[0] = (undefined1)uVar40;
          auVar92[1] = auVar92[0];
          auVar92._8_8_ = 0;
          auVar65 = pshuflw(auVar92,auVar92,0);
          cVar58 = auVar65[0];
          auVar66[0] = -(cVar58 == *pcVar6);
          cVar86 = auVar65[1];
          auVar66[1] = -(cVar86 == pcVar6[1]);
          cVar88 = auVar65[2];
          auVar66[2] = -(cVar88 == pcVar6[2]);
          cVar90 = auVar65[3];
          auVar66[3] = -(cVar90 == pcVar6[3]);
          auVar66[4] = -(cVar58 == pcVar6[4]);
          auVar66[5] = -(cVar86 == pcVar6[5]);
          auVar66[6] = -(cVar88 == pcVar6[6]);
          auVar66[7] = -(cVar90 == pcVar6[7]);
          auVar66[8] = -(cVar58 == pcVar6[8]);
          auVar66[9] = -(cVar86 == pcVar6[9]);
          auVar66[10] = -(cVar88 == pcVar6[10]);
          auVar66[0xb] = -(cVar90 == pcVar6[0xb]);
          auVar66[0xc] = -(cVar58 == pcVar6[0xc]);
          auVar66[0xd] = -(cVar86 == pcVar6[0xd]);
          auVar66[0xe] = -(cVar88 == pcVar6[0xe]);
          auVar66[0xf] = -(cVar90 == pcVar6[0xf]);
          uVar13 = (ushort)(SUB161(auVar66 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar66[0xf] >> 7) << 0xf;
          uVar40 = (uint)uVar13;
          if ((bVar25 & 0xf) != 0) {
            uVar40 = (uint)uVar13 << (0x10 - (bVar25 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar13 >> (bVar25 & 0xf));
          }
          if (uVar40 == 0) {
            lVar37 = 0;
          }
          else {
            lVar46 = 0;
            while( true ) {
              iVar43 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                }
              }
              lVar37 = lVar46;
              if (pUVar11[uVar41 + (iVar43 + (uint)bVar25 & 0xf)] < uVar27) break;
              lVar37 = lVar46 + 1;
              auStack_c8[lVar46] = pUVar11[uVar41 + (iVar43 + (uint)bVar25 & 0xf)];
              uVar40 = uVar40 & uVar40 - 1;
              if ((uVar40 == 0) ||
                 (iVar43 = (int)lVar46, lVar46 = lVar37, (int)(1L << (bVar24 & 0x3f)) + -1 == iVar43
                 )) break;
            }
          }
          uVar40 = bVar25 - 1 & 0xf;
          *(char *)(pUVar12 + uVar41) = (char)uVar40;
          *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar92[0];
          UVar35 = ms->nextToUpdate;
          ms->nextToUpdate = UVar35 + 1;
          pUVar11[uVar41 + uVar40] = UVar35;
          if (lVar37 == 0) goto LAB_006dc7c4;
          local_1d0 = 999999999;
          lVar46 = 0;
          uVar41 = 3;
          do {
            uVar40 = auStack_c8[lVar46];
            uVar38 = (ulong)uVar40;
            if (uVar40 < uVar31) {
              if (*(int *)(pBVar23 + uVar38) == (int)*puVar47) {
                sVar21 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar47 + 4),pBVar23 + uVar38 + 4,(BYTE *)iEnd,
                                    pBVar23 + uVar31,pBVar30 + uVar31);
                uVar38 = sVar21 + 4;
LAB_006dc796:
                if ((uVar41 < uVar38) &&
                   (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar38,
                   (ulong *)((long)puVar47 + uVar38) == iEnd)) break;
              }
            }
            else {
              puVar42 = (ulong *)(pBVar30 + uVar38);
              if (*(BYTE *)(uVar41 + (long)puVar42) == *(BYTE *)((long)puVar47 + uVar41)) {
                puVar22 = puVar47;
                if (puVar47 < puVar1) {
                  if (*puVar42 == *puVar47) {
                    lVar29 = 0;
                    do {
                      puVar22 = (ulong *)((long)puVar47 + lVar29 + 8);
                      if (puVar1 <= puVar22) {
                        puVar42 = (ulong *)(pBVar30 + lVar29 + uVar38 + 8);
                        goto LAB_006dc753;
                      }
                      lVar15 = lVar29 + uVar38 + 8;
                      lVar29 = lVar29 + 8;
                    } while (*(ulong *)(pBVar30 + lVar15) == *puVar22);
                    uVar39 = *puVar22 ^ *(ulong *)(pBVar30 + lVar15);
                    uVar38 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar29;
                  }
                  else {
                    uVar39 = *puVar47 ^ *puVar42;
                    uVar38 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = uVar38 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_006dc753:
                  if ((puVar22 < puVar2) && ((int)*puVar42 == (int)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 4);
                    puVar42 = (ulong *)((long)puVar42 + 4);
                  }
                  if ((puVar22 < puVar3) && ((short)*puVar42 == (short)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 2);
                    puVar42 = (ulong *)((long)puVar42 + 2);
                  }
                  if (puVar22 < iEnd) {
                    puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar22));
                  }
                  uVar38 = (long)puVar22 - (long)puVar47;
                }
                goto LAB_006dc796;
              }
            }
            uVar38 = uVar41;
            lVar46 = lVar46 + 1;
            uVar41 = uVar38;
          } while (lVar46 != lVar37);
        }
      }
      else if (uVar44 - 6 < 2) {
        pBVar30 = (ms->window).base;
        uVar41 = (long)puVar47 - (long)pBVar30;
        uVar44 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar31 = (uint)uVar41;
        uVar27 = uVar31 - uVar44;
        if (uVar31 - uVar40 <= uVar44) {
          uVar27 = uVar40;
        }
        pBVar23 = (ms->window).dictBase;
        uVar44 = (ms->window).dictLimit;
        pUVar11 = ms->hashTable;
        pUVar12 = ms->tagTable;
        if (UVar35 != 0) {
          uVar27 = uVar40;
        }
        uVar38 = (ulong)ms->nextToUpdate;
        bVar24 = 0x38 - (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar31) {
          do {
            uVar45 = (uint)uVar38 & 7;
            uVar40 = ms->hashCache[uVar45];
            ms->hashCache[uVar45] =
                 (U32)((ulong)(*(long *)(pBVar30 + uVar38 + 8) * -0x30e4432340650000) >>
                      (bVar24 & 0x3f));
            uVar39 = (ulong)(uVar40 >> 3 & 0xffffffe0);
            uVar45 = (byte)((char)pUVar12[uVar39] - 1) & 0x1f;
            *(char *)(pUVar12 + uVar39) = (char)uVar45;
            *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar39 * 2) = (char)uVar40;
            pUVar11[uVar39 + uVar45] = (uint)uVar38;
            uVar38 = uVar38 + 1;
          } while (uVar38 < (uVar41 & 0xffffffff));
        }
        ms->nextToUpdate = uVar31;
        uVar40 = ms->hashCache[uVar31 & 7];
        ms->hashCache[uVar31 & 7] =
             (U32)((ulong)(*(long *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x30e4432340650000) >>
                  (bVar24 & 0x3f));
        uVar41 = (ulong)(uVar40 >> 3 & 0xffffffe0);
        bVar24 = (byte)pUVar12[uVar41];
        pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
        pcVar7 = (char *)((long)pUVar12 + uVar41 * 2 + 0x11);
        uVar89 = (undefined1)(uVar40 >> 0x18);
        uVar87 = (undefined1)(uVar40 >> 0x10);
        uVar85 = (undefined1)(uVar40 >> 8);
        auVar91._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40)) >>
                  0x20);
        auVar91[3] = uVar85;
        auVar91[2] = uVar85;
        auVar91[0] = (undefined1)uVar40;
        auVar91[1] = auVar91[0];
        auVar91._8_8_ = 0;
        auVar92 = pshuflw(auVar91,auVar91,0);
        cVar58 = auVar92[0];
        auVar49[0] = -(*pcVar6 == cVar58);
        cVar86 = auVar92[1];
        auVar49[1] = -(pcVar6[1] == cVar86);
        cVar88 = auVar92[2];
        auVar49[2] = -(pcVar6[2] == cVar88);
        cVar90 = auVar92[3];
        auVar49[3] = -(pcVar6[3] == cVar90);
        auVar49[4] = -(pcVar6[4] == cVar58);
        auVar49[5] = -(pcVar6[5] == cVar86);
        auVar49[6] = -(pcVar6[6] == cVar88);
        auVar49[7] = -(pcVar6[7] == cVar90);
        auVar49[8] = -(pcVar6[8] == cVar58);
        auVar49[9] = -(pcVar6[9] == cVar86);
        auVar49[10] = -(pcVar6[10] == cVar88);
        auVar49[0xb] = -(pcVar6[0xb] == cVar90);
        auVar49[0xc] = -(pcVar6[0xc] == cVar58);
        auVar49[0xd] = -(pcVar6[0xd] == cVar86);
        auVar49[0xe] = -(pcVar6[0xe] == cVar88);
        auVar49[0xf] = -(pcVar6[0xf] == cVar90);
        auVar59[0] = -(*pcVar7 == cVar58);
        auVar59[1] = -(pcVar7[1] == cVar86);
        auVar59[2] = -(pcVar7[2] == cVar88);
        auVar59[3] = -(pcVar7[3] == cVar90);
        auVar59[4] = -(pcVar7[4] == cVar58);
        auVar59[5] = -(pcVar7[5] == cVar86);
        auVar59[6] = -(pcVar7[6] == cVar88);
        auVar59[7] = -(pcVar7[7] == cVar90);
        auVar59[8] = -(pcVar7[8] == cVar58);
        auVar59[9] = -(pcVar7[9] == cVar86);
        auVar59[10] = -(pcVar7[10] == cVar88);
        auVar59[0xb] = -(pcVar7[0xb] == cVar90);
        auVar59[0xc] = -(pcVar7[0xc] == cVar58);
        auVar59[0xd] = -(pcVar7[0xd] == cVar86);
        auVar59[0xe] = -(pcVar7[0xe] == cVar88);
        auVar59[0xf] = -(pcVar7[0xf] == cVar90);
        uVar45 = CONCAT22((ushort)(SUB161(auVar59 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar59 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar59[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar49 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar49[0xf] >> 7) << 0xf);
        uVar40 = uVar45 >> (bVar24 & 0x1f) | uVar45 << 0x20 - (bVar24 & 0x1f);
        if ((bVar24 & 0x1f) == 0) {
          uVar40 = uVar45;
        }
        if (uVar40 == 0) {
          lVar37 = 0;
        }
        else {
          lVar46 = 0;
          while( true ) {
            iVar43 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
              }
            }
            lVar37 = lVar46;
            if (pUVar11[uVar41 + (iVar43 + (uint)bVar24 & 0x1f)] < uVar27) break;
            lVar37 = lVar46 + 1;
            auStack_c8[lVar46] = pUVar11[uVar41 + (iVar43 + (uint)bVar24 & 0x1f)];
            uVar40 = uVar40 & uVar40 - 1;
            if ((uVar40 == 0) || (iVar43 = (int)lVar46, lVar46 = lVar37, iVar43 == 0x1f)) break;
          }
        }
        uVar40 = bVar24 - 1 & 0x1f;
        *(char *)(pUVar12 + uVar41) = (char)uVar40;
        *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar91[0];
        UVar35 = ms->nextToUpdate;
        ms->nextToUpdate = UVar35 + 1;
        pUVar11[uVar41 + uVar40] = UVar35;
        if (lVar37 == 0) goto LAB_006dc7c4;
        local_1d0 = 999999999;
        lVar46 = 0;
        uVar41 = 3;
        do {
          uVar40 = auStack_c8[lVar46];
          uVar38 = (ulong)uVar40;
          if (uVar40 < uVar44) {
            if (*(int *)(pBVar23 + uVar38) == (int)*puVar47) {
              sVar21 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar47 + 4),pBVar23 + uVar38 + 4,(BYTE *)iEnd,
                                  pBVar23 + uVar44,pBVar30 + uVar44);
              uVar38 = sVar21 + 4;
LAB_006dbddf:
              if ((uVar41 < uVar38) &&
                 (local_1d0 = (ulong)((uVar31 + 2) - uVar40), uVar41 = uVar38,
                 (ulong *)((long)puVar47 + uVar38) == iEnd)) break;
            }
          }
          else {
            puVar42 = (ulong *)(pBVar30 + uVar38);
            if (*(BYTE *)(uVar41 + (long)puVar42) == *(BYTE *)((long)puVar47 + uVar41)) {
              puVar22 = puVar47;
              if (puVar47 < puVar1) {
                if (*puVar42 == *puVar47) {
                  lVar29 = 0;
                  do {
                    puVar22 = (ulong *)((long)puVar47 + lVar29 + 8);
                    if (puVar1 <= puVar22) {
                      puVar42 = (ulong *)(pBVar30 + lVar29 + uVar38 + 8);
                      goto LAB_006dbd9c;
                    }
                    lVar15 = lVar29 + uVar38 + 8;
                    lVar29 = lVar29 + 8;
                  } while (*(ulong *)(pBVar30 + lVar15) == *puVar22);
                  uVar39 = *puVar22 ^ *(ulong *)(pBVar30 + lVar15);
                  uVar38 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar29;
                }
                else {
                  uVar39 = *puVar47 ^ *puVar42;
                  uVar38 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar38 = uVar38 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_006dbd9c:
                if ((puVar22 < puVar2) && ((int)*puVar42 == (int)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 4);
                  puVar42 = (ulong *)((long)puVar42 + 4);
                }
                if ((puVar22 < puVar3) && ((short)*puVar42 == (short)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 2);
                  puVar42 = (ulong *)((long)puVar42 + 2);
                }
                if (puVar22 < iEnd) {
                  puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar22));
                }
                uVar38 = (long)puVar22 - (long)puVar47;
              }
              goto LAB_006dbddf;
            }
          }
          uVar38 = uVar41;
          lVar46 = lVar46 + 1;
          uVar41 = uVar38;
        } while (lVar46 != lVar37);
      }
      else if (uVar44 == 5) {
        pBVar30 = (ms->window).base;
        uVar41 = (long)puVar47 - (long)pBVar30;
        uVar44 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar31 = (uint)uVar41;
        uVar27 = uVar31 - uVar44;
        if (uVar31 - uVar40 <= uVar44) {
          uVar27 = uVar40;
        }
        pBVar23 = (ms->window).dictBase;
        uVar44 = (ms->window).dictLimit;
        pUVar11 = ms->hashTable;
        pUVar12 = ms->tagTable;
        if (UVar35 != 0) {
          uVar27 = uVar40;
        }
        uVar38 = (ulong)ms->nextToUpdate;
        bVar24 = 0x38 - (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar31) {
          do {
            uVar45 = (uint)uVar38 & 7;
            uVar40 = ms->hashCache[uVar45];
            ms->hashCache[uVar45] =
                 (U32)((ulong)(*(long *)(pBVar30 + uVar38 + 8) * -0x30e4432345000000) >>
                      (bVar24 & 0x3f));
            uVar39 = (ulong)(uVar40 >> 3 & 0xffffffe0);
            uVar45 = (byte)((char)pUVar12[uVar39] - 1) & 0x1f;
            *(char *)(pUVar12 + uVar39) = (char)uVar45;
            *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar39 * 2) = (char)uVar40;
            pUVar11[uVar39 + uVar45] = (uint)uVar38;
            uVar38 = uVar38 + 1;
          } while (uVar38 < (uVar41 & 0xffffffff));
        }
        ms->nextToUpdate = uVar31;
        uVar40 = ms->hashCache[uVar31 & 7];
        ms->hashCache[uVar31 & 7] =
             (U32)((ulong)(*(long *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x30e4432345000000) >>
                  (bVar24 & 0x3f));
        uVar41 = (ulong)(uVar40 >> 3 & 0xffffffe0);
        bVar24 = (byte)pUVar12[uVar41];
        pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
        pcVar7 = (char *)((long)pUVar12 + uVar41 * 2 + 0x11);
        uVar89 = (undefined1)(uVar40 >> 0x18);
        uVar87 = (undefined1)(uVar40 >> 0x10);
        uVar85 = (undefined1)(uVar40 >> 8);
        auVar93._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40)) >>
                  0x20);
        auVar93[3] = uVar85;
        auVar93[2] = uVar85;
        auVar93[0] = (undefined1)uVar40;
        auVar93[1] = auVar93[0];
        auVar93._8_8_ = 0;
        auVar92 = pshuflw(auVar93,auVar93,0);
        cVar58 = auVar92[0];
        auVar50[0] = -(*pcVar6 == cVar58);
        cVar86 = auVar92[1];
        auVar50[1] = -(pcVar6[1] == cVar86);
        cVar88 = auVar92[2];
        auVar50[2] = -(pcVar6[2] == cVar88);
        cVar90 = auVar92[3];
        auVar50[3] = -(pcVar6[3] == cVar90);
        auVar50[4] = -(pcVar6[4] == cVar58);
        auVar50[5] = -(pcVar6[5] == cVar86);
        auVar50[6] = -(pcVar6[6] == cVar88);
        auVar50[7] = -(pcVar6[7] == cVar90);
        auVar50[8] = -(pcVar6[8] == cVar58);
        auVar50[9] = -(pcVar6[9] == cVar86);
        auVar50[10] = -(pcVar6[10] == cVar88);
        auVar50[0xb] = -(pcVar6[0xb] == cVar90);
        auVar50[0xc] = -(pcVar6[0xc] == cVar58);
        auVar50[0xd] = -(pcVar6[0xd] == cVar86);
        auVar50[0xe] = -(pcVar6[0xe] == cVar88);
        auVar50[0xf] = -(pcVar6[0xf] == cVar90);
        auVar62[0] = -(*pcVar7 == cVar58);
        auVar62[1] = -(pcVar7[1] == cVar86);
        auVar62[2] = -(pcVar7[2] == cVar88);
        auVar62[3] = -(pcVar7[3] == cVar90);
        auVar62[4] = -(pcVar7[4] == cVar58);
        auVar62[5] = -(pcVar7[5] == cVar86);
        auVar62[6] = -(pcVar7[6] == cVar88);
        auVar62[7] = -(pcVar7[7] == cVar90);
        auVar62[8] = -(pcVar7[8] == cVar58);
        auVar62[9] = -(pcVar7[9] == cVar86);
        auVar62[10] = -(pcVar7[10] == cVar88);
        auVar62[0xb] = -(pcVar7[0xb] == cVar90);
        auVar62[0xc] = -(pcVar7[0xc] == cVar58);
        auVar62[0xd] = -(pcVar7[0xd] == cVar86);
        auVar62[0xe] = -(pcVar7[0xe] == cVar88);
        auVar62[0xf] = -(pcVar7[0xf] == cVar90);
        uVar45 = CONCAT22((ushort)(SUB161(auVar62 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar62 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar62 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar62 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar62 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar62 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar62 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar62 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar62 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar62 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar62 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar62 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar62 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar62 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar62 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar62[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar50 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar50[0xf] >> 7) << 0xf);
        uVar40 = uVar45 >> (bVar24 & 0x1f) | uVar45 << 0x20 - (bVar24 & 0x1f);
        if ((bVar24 & 0x1f) == 0) {
          uVar40 = uVar45;
        }
        if (uVar40 == 0) {
          lVar37 = 0;
        }
        else {
          lVar46 = 0;
          while( true ) {
            iVar43 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
              }
            }
            lVar37 = lVar46;
            if (pUVar11[uVar41 + (iVar43 + (uint)bVar24 & 0x1f)] < uVar27) break;
            lVar37 = lVar46 + 1;
            auStack_c8[lVar46] = pUVar11[uVar41 + (iVar43 + (uint)bVar24 & 0x1f)];
            uVar40 = uVar40 & uVar40 - 1;
            if ((uVar40 == 0) || (iVar43 = (int)lVar46, lVar46 = lVar37, iVar43 == 0x1f)) break;
          }
        }
        uVar40 = bVar24 - 1 & 0x1f;
        *(char *)(pUVar12 + uVar41) = (char)uVar40;
        *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar93[0];
        UVar35 = ms->nextToUpdate;
        ms->nextToUpdate = UVar35 + 1;
        pUVar11[uVar41 + uVar40] = UVar35;
        if (lVar37 == 0) {
LAB_006dc7c4:
          uVar38 = 3;
          local_1d0 = 999999999;
        }
        else {
          local_1d0 = 999999999;
          lVar46 = 0;
          uVar41 = 3;
          do {
            uVar40 = auStack_c8[lVar46];
            uVar38 = (ulong)uVar40;
            if (uVar40 < uVar44) {
              if (*(int *)(pBVar23 + uVar38) == (int)*puVar47) {
                sVar21 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar47 + 4),pBVar23 + uVar38 + 4,(BYTE *)iEnd,
                                    pBVar23 + uVar44,pBVar30 + uVar44);
                uVar38 = sVar21 + 4;
LAB_006dc1f4:
                if ((uVar41 < uVar38) &&
                   (local_1d0 = (ulong)((uVar31 + 2) - uVar40), uVar41 = uVar38,
                   (ulong *)((long)puVar47 + uVar38) == iEnd)) break;
              }
            }
            else {
              puVar42 = (ulong *)(pBVar30 + uVar38);
              if (*(BYTE *)(uVar41 + (long)puVar42) == *(BYTE *)((long)puVar47 + uVar41)) {
                puVar22 = puVar47;
                if (puVar47 < puVar1) {
                  if (*puVar42 == *puVar47) {
                    lVar29 = 0;
                    do {
                      puVar22 = (ulong *)((long)puVar47 + lVar29 + 8);
                      if (puVar1 <= puVar22) {
                        puVar42 = (ulong *)(pBVar30 + lVar29 + uVar38 + 8);
                        goto LAB_006dc1b1;
                      }
                      lVar15 = lVar29 + uVar38 + 8;
                      lVar29 = lVar29 + 8;
                    } while (*(ulong *)(pBVar30 + lVar15) == *puVar22);
                    uVar39 = *puVar22 ^ *(ulong *)(pBVar30 + lVar15);
                    uVar38 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar29;
                  }
                  else {
                    uVar39 = *puVar47 ^ *puVar42;
                    uVar38 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = uVar38 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_006dc1b1:
                  if ((puVar22 < puVar2) && ((int)*puVar42 == (int)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 4);
                    puVar42 = (ulong *)((long)puVar42 + 4);
                  }
                  if ((puVar22 < puVar3) && ((short)*puVar42 == (short)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 2);
                    puVar42 = (ulong *)((long)puVar42 + 2);
                  }
                  if (puVar22 < iEnd) {
                    puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar22));
                  }
                  uVar38 = (long)puVar22 - (long)puVar47;
                }
                goto LAB_006dc1f4;
              }
            }
            uVar38 = uVar41;
            lVar46 = lVar46 + 1;
            uVar41 = uVar38;
          } while (lVar46 != lVar37);
        }
      }
      else {
        pBVar30 = (ms->window).base;
        uVar41 = (long)puVar47 - (long)pBVar30;
        uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar44 = (uint)uVar41;
        uVar27 = uVar44 - uVar31;
        if (uVar44 - uVar40 <= uVar31) {
          uVar27 = uVar40;
        }
        pBVar23 = (ms->window).dictBase;
        uVar31 = (ms->window).dictLimit;
        pUVar11 = ms->hashTable;
        pUVar12 = ms->tagTable;
        if (UVar35 != 0) {
          uVar27 = uVar40;
        }
        uVar38 = (ulong)ms->nextToUpdate;
        bVar24 = 0x18 - (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar44) {
          do {
            uVar45 = (uint)uVar38 & 7;
            uVar40 = ms->hashCache[uVar45];
            ms->hashCache[uVar45] =
                 (uint)(*(int *)(pBVar30 + uVar38 + 8) * -0x61c8864f) >> (bVar24 & 0x1f);
            uVar39 = (ulong)(uVar40 >> 3 & 0xffffffe0);
            uVar45 = (byte)((char)pUVar12[uVar39] - 1) & 0x1f;
            *(char *)(pUVar12 + uVar39) = (char)uVar45;
            *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar39 * 2) = (char)uVar40;
            pUVar11[uVar39 + uVar45] = (uint)uVar38;
            uVar38 = uVar38 + 1;
          } while (uVar38 < (uVar41 & 0xffffffff));
        }
        ms->nextToUpdate = uVar44;
        uVar40 = ms->hashCache[uVar44 & 7];
        ms->hashCache[uVar44 & 7] =
             (uint)(*(int *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x61c8864f) >> (bVar24 & 0x1f);
        uVar41 = (ulong)(uVar40 >> 3 & 0xffffffe0);
        bVar24 = (byte)pUVar12[uVar41];
        pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
        pcVar7 = (char *)((long)pUVar12 + uVar41 * 2 + 0x11);
        uVar89 = (undefined1)(uVar40 >> 0x18);
        uVar87 = (undefined1)(uVar40 >> 0x10);
        uVar85 = (undefined1)(uVar40 >> 8);
        auVar94._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40)) >>
                  0x20);
        auVar94[3] = uVar85;
        auVar94[2] = uVar85;
        auVar94[0] = (undefined1)uVar40;
        auVar94[1] = auVar94[0];
        auVar94._8_8_ = 0;
        auVar92 = pshuflw(auVar94,auVar94,0);
        cVar58 = auVar92[0];
        auVar51[0] = -(*pcVar6 == cVar58);
        cVar86 = auVar92[1];
        auVar51[1] = -(pcVar6[1] == cVar86);
        cVar88 = auVar92[2];
        auVar51[2] = -(pcVar6[2] == cVar88);
        cVar90 = auVar92[3];
        auVar51[3] = -(pcVar6[3] == cVar90);
        auVar51[4] = -(pcVar6[4] == cVar58);
        auVar51[5] = -(pcVar6[5] == cVar86);
        auVar51[6] = -(pcVar6[6] == cVar88);
        auVar51[7] = -(pcVar6[7] == cVar90);
        auVar51[8] = -(pcVar6[8] == cVar58);
        auVar51[9] = -(pcVar6[9] == cVar86);
        auVar51[10] = -(pcVar6[10] == cVar88);
        auVar51[0xb] = -(pcVar6[0xb] == cVar90);
        auVar51[0xc] = -(pcVar6[0xc] == cVar58);
        auVar51[0xd] = -(pcVar6[0xd] == cVar86);
        auVar51[0xe] = -(pcVar6[0xe] == cVar88);
        auVar51[0xf] = -(pcVar6[0xf] == cVar90);
        auVar64[0] = -(*pcVar7 == cVar58);
        auVar64[1] = -(pcVar7[1] == cVar86);
        auVar64[2] = -(pcVar7[2] == cVar88);
        auVar64[3] = -(pcVar7[3] == cVar90);
        auVar64[4] = -(pcVar7[4] == cVar58);
        auVar64[5] = -(pcVar7[5] == cVar86);
        auVar64[6] = -(pcVar7[6] == cVar88);
        auVar64[7] = -(pcVar7[7] == cVar90);
        auVar64[8] = -(pcVar7[8] == cVar58);
        auVar64[9] = -(pcVar7[9] == cVar86);
        auVar64[10] = -(pcVar7[10] == cVar88);
        auVar64[0xb] = -(pcVar7[0xb] == cVar90);
        auVar64[0xc] = -(pcVar7[0xc] == cVar58);
        auVar64[0xd] = -(pcVar7[0xd] == cVar86);
        auVar64[0xe] = -(pcVar7[0xe] == cVar88);
        auVar64[0xf] = -(pcVar7[0xf] == cVar90);
        uVar45 = CONCAT22((ushort)(SUB161(auVar64 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar64[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar51 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar51[0xf] >> 7) << 0xf);
        uVar40 = uVar45 >> (bVar24 & 0x1f) | uVar45 << 0x20 - (bVar24 & 0x1f);
        if ((bVar24 & 0x1f) == 0) {
          uVar40 = uVar45;
        }
        if (uVar40 == 0) {
          lVar37 = 0;
        }
        else {
          lVar46 = 0;
          while( true ) {
            iVar43 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
              }
            }
            lVar37 = lVar46;
            if (pUVar11[uVar41 + (iVar43 + (uint)bVar24 & 0x1f)] < uVar27) break;
            lVar37 = lVar46 + 1;
            auStack_c8[lVar46] = pUVar11[uVar41 + (iVar43 + (uint)bVar24 & 0x1f)];
            uVar40 = uVar40 & uVar40 - 1;
            if ((uVar40 == 0) || (iVar43 = (int)lVar46, lVar46 = lVar37, iVar43 == 0x1f)) break;
          }
        }
        uVar40 = bVar24 - 1 & 0x1f;
        *(char *)(pUVar12 + uVar41) = (char)uVar40;
        *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar94[0];
        UVar35 = ms->nextToUpdate;
        ms->nextToUpdate = UVar35 + 1;
        pUVar11[uVar41 + uVar40] = UVar35;
        if (lVar37 == 0) goto LAB_006dc7c4;
        local_1d0 = 999999999;
        lVar46 = 0;
        uVar41 = 3;
        do {
          uVar40 = auStack_c8[lVar46];
          uVar38 = (ulong)uVar40;
          if (uVar40 < uVar31) {
            if (*(int *)(pBVar23 + uVar38) == (int)*puVar47) {
              sVar21 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar47 + 4),pBVar23 + uVar38 + 4,(BYTE *)iEnd,
                                  pBVar23 + uVar31,pBVar30 + uVar31);
              uVar38 = sVar21 + 4;
LAB_006dc5bd:
              if ((uVar41 < uVar38) &&
                 (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar38,
                 (ulong *)((long)puVar47 + uVar38) == iEnd)) break;
            }
          }
          else {
            puVar42 = (ulong *)(pBVar30 + uVar38);
            if (*(BYTE *)(uVar41 + (long)puVar42) == *(BYTE *)((long)puVar47 + uVar41)) {
              puVar22 = puVar47;
              if (puVar47 < puVar1) {
                if (*puVar42 == *puVar47) {
                  lVar29 = 0;
                  do {
                    puVar22 = (ulong *)((long)puVar47 + lVar29 + 8);
                    if (puVar1 <= puVar22) {
                      puVar42 = (ulong *)(pBVar30 + lVar29 + uVar38 + 8);
                      goto LAB_006dc57a;
                    }
                    lVar15 = lVar29 + uVar38 + 8;
                    lVar29 = lVar29 + 8;
                  } while (*(ulong *)(pBVar30 + lVar15) == *puVar22);
                  uVar39 = *puVar22 ^ *(ulong *)(pBVar30 + lVar15);
                  uVar38 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar29;
                }
                else {
                  uVar39 = *puVar47 ^ *puVar42;
                  uVar38 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar38 = uVar38 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_006dc57a:
                if ((puVar22 < puVar2) && ((int)*puVar42 == (int)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 4);
                  puVar42 = (ulong *)((long)puVar42 + 4);
                }
                if ((puVar22 < puVar3) && ((short)*puVar42 == (short)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 2);
                  puVar42 = (ulong *)((long)puVar42 + 2);
                }
                if (puVar22 < iEnd) {
                  puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar22));
                }
                uVar38 = (long)puVar22 - (long)puVar47;
              }
              goto LAB_006dc5bd;
            }
          }
          uVar38 = uVar41;
          lVar46 = lVar46 + 1;
          uVar41 = uVar38;
        } while (lVar46 != lVar37);
      }
      uVar41 = uVar20;
      if (uVar20 < uVar38) {
        uVar41 = uVar38;
      }
      if (uVar41 < 4) {
        puVar47 = (ulong *)((long)puVar47 + ((long)puVar47 - (long)local_108 >> 8) + 1);
      }
      else {
        puVar42 = puVar47;
        if (uVar38 <= uVar20) {
          local_1d0 = 0;
          puVar47 = (ulong *)((long)puVar47 + 1U);
        }
LAB_006dc84c:
        do {
          iVar43 = iVar33;
          uVar38 = uVar41;
          puVar22 = puVar42;
          uVar20 = local_1d0;
          local_168 = puVar47;
          if (iLimit <= puVar22) break;
          puVar42 = (ulong *)((long)puVar22 + 1);
          iVar33 = iVar43 + 1;
          if (local_1d0 == 0) {
            uVar20 = 0;
          }
          else {
            UVar35 = (ms->window).lowLimit;
            UVar26 = iVar33 - uVar17;
            if (iVar33 - UVar35 <= uVar17) {
              UVar26 = UVar35;
            }
            if (ms->loadedDictEnd != 0) {
              UVar26 = UVar35;
            }
            uVar40 = iVar33 - local_17c;
            pBVar30 = base_11;
            if (uVar40 < uVar8) {
              pBVar30 = pBVar10;
            }
            if (((2 < iVar18 - uVar40) && (local_17c < iVar33 - UVar26)) &&
               (*(int *)puVar42 == *(int *)(pBVar30 + uVar40))) {
              puVar47 = iEnd;
              if (uVar40 < uVar8) {
                puVar47 = puVar19;
              }
              sVar21 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar22 + 5),(BYTE *)((long)(pBVar30 + uVar40) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar47,iStart);
              if (sVar21 < 0xfffffffffffffffc) {
                uVar27 = (int)local_1d0 + 1;
                uVar40 = 0x1f;
                if (uVar27 != 0) {
                  for (; uVar27 >> uVar40 == 0; uVar40 = uVar40 - 1) {
                  }
                }
                if ((int)((uVar40 ^ 0x1f) + (int)uVar38 * 3 + -0x1e) < (int)(sVar21 + 4) * 3) {
                  uVar20 = 0;
                  uVar38 = sVar21 + 4;
                  local_168 = puVar42;
                }
              }
            }
          }
          uVar40 = (ms->cParams).searchLog;
          uVar27 = (ms->cParams).minMatch;
          if (uVar40 < 5) {
            bVar24 = (byte)uVar40;
            if (uVar27 - 6 < 2) {
              pUVar11 = ms->hashTable;
              pUVar12 = ms->tagTable;
              pBVar30 = (ms->window).base;
              uVar41 = (long)puVar42 - (long)pBVar30;
              uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar40 = (ms->window).lowLimit;
              uVar44 = (uint)uVar41;
              uVar27 = uVar44 - uVar31;
              if (uVar44 - uVar40 <= uVar31) {
                uVar27 = uVar40;
              }
              pBVar23 = (ms->window).dictBase;
              uVar31 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar27 = uVar40;
              }
              uVar39 = (ulong)ms->nextToUpdate;
              bVar25 = 0x38 - (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar44) {
                do {
                  uVar45 = (uint)uVar39 & 7;
                  uVar40 = ms->hashCache[uVar45];
                  ms->hashCache[uVar45] =
                       (U32)((ulong)(*(long *)(pBVar30 + uVar39 + 8) * -0x30e4432340650000) >>
                            (bVar25 & 0x3f));
                  uVar36 = (ulong)(uVar40 >> 4 & 0xfffffff0);
                  uVar45 = (byte)((char)pUVar12[uVar36] - 1) & 0xf;
                  *(char *)(pUVar12 + uVar36) = (char)uVar45;
                  *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar36 * 2) = (char)uVar40;
                  pUVar11[uVar36 + uVar45] = (uint)uVar39;
                  uVar39 = uVar39 + 1;
                } while (uVar39 < (uVar41 & 0xffffffff));
              }
              ms->nextToUpdate = uVar44;
              uVar40 = ms->hashCache[uVar44 & 7];
              ms->hashCache[uVar44 & 7] =
                   (U32)((ulong)(*(long *)(pBVar30 + (uVar41 & 0xffffffff) + 8) *
                                -0x30e4432340650000) >> (bVar25 & 0x3f));
              uVar41 = (ulong)(uVar40 >> 4 & 0xfffffff0);
              bVar25 = (byte)pUVar12[uVar41];
              pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
              uVar89 = (undefined1)(uVar40 >> 0x18);
              uVar87 = (undefined1)(uVar40 >> 0x10);
              uVar85 = (undefined1)(uVar40 >> 8);
              auVar68._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40))
                        >> 0x20);
              auVar68[3] = uVar85;
              auVar68[2] = uVar85;
              auVar68[0] = (undefined1)uVar40;
              auVar68[1] = auVar68[0];
              auVar68._8_8_ = 0;
              auVar92 = pshuflw(auVar68,auVar68,0);
              cVar58 = auVar92[0];
              auVar69[0] = -(cVar58 == *pcVar6);
              cVar86 = auVar92[1];
              auVar69[1] = -(cVar86 == pcVar6[1]);
              cVar88 = auVar92[2];
              auVar69[2] = -(cVar88 == pcVar6[2]);
              cVar90 = auVar92[3];
              auVar69[3] = -(cVar90 == pcVar6[3]);
              auVar69[4] = -(cVar58 == pcVar6[4]);
              auVar69[5] = -(cVar86 == pcVar6[5]);
              auVar69[6] = -(cVar88 == pcVar6[6]);
              auVar69[7] = -(cVar90 == pcVar6[7]);
              auVar69[8] = -(cVar58 == pcVar6[8]);
              auVar69[9] = -(cVar86 == pcVar6[9]);
              auVar69[10] = -(cVar88 == pcVar6[10]);
              auVar69[0xb] = -(cVar90 == pcVar6[0xb]);
              auVar69[0xc] = -(cVar58 == pcVar6[0xc]);
              auVar69[0xd] = -(cVar86 == pcVar6[0xd]);
              auVar69[0xe] = -(cVar88 == pcVar6[0xe]);
              auVar69[0xf] = -(cVar90 == pcVar6[0xf]);
              uVar13 = (ushort)(SUB161(auVar69 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar69[0xf] >> 7) << 0xf;
              uVar40 = (uint)uVar13;
              if ((bVar25 & 0xf) != 0) {
                uVar40 = (uint)uVar13 << (0x10 - (bVar25 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar13 >> (bVar25 & 0xf));
              }
              if (uVar40 == 0) {
                lVar37 = 0;
              }
              else {
                lVar46 = 0;
                while( true ) {
                  iVar28 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
                    }
                  }
                  lVar37 = lVar46;
                  if (pUVar11[uVar41 + (iVar28 + (uint)bVar25 & 0xf)] < uVar27) break;
                  lVar37 = lVar46 + 1;
                  auStack_c8[lVar46] = pUVar11[uVar41 + (iVar28 + (uint)bVar25 & 0xf)];
                  uVar40 = uVar40 & uVar40 - 1;
                  if ((uVar40 == 0) ||
                     (iVar28 = (int)lVar46, lVar46 = lVar37,
                     (int)(1L << (bVar24 & 0x3f)) + -1 == iVar28)) break;
                }
              }
              uVar40 = bVar25 - 1 & 0xf;
              *(char *)(pUVar12 + uVar41) = (char)uVar40;
              *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar68[0];
              UVar35 = ms->nextToUpdate;
              ms->nextToUpdate = UVar35 + 1;
              pUVar11[uVar41 + uVar40] = UVar35;
              if (lVar37 == 0) goto LAB_006dde1c;
              local_1d0 = 999999999;
              uVar41 = 3;
              lVar46 = 0;
              do {
                uVar40 = auStack_c8[lVar46];
                uVar39 = (ulong)uVar40;
                if (uVar40 < uVar31) {
                  if (*(int *)(pBVar23 + uVar39) == *(int *)puVar42) {
                    sVar21 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar22 + 5),pBVar23 + uVar39 + 4,
                                        (BYTE *)iEnd,pBVar23 + uVar31,pBVar30 + uVar31);
                    uVar39 = sVar21 + 4;
LAB_006dd824:
                    if ((uVar41 < uVar39) &&
                       (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar39,
                       (ulong *)((long)puVar42 + uVar39) == iEnd)) break;
                  }
                }
                else {
                  puVar47 = (ulong *)(pBVar30 + uVar39);
                  if (*(BYTE *)(uVar41 + (long)puVar47) == *(BYTE *)((long)puVar42 + uVar41)) {
                    puVar48 = puVar42;
                    if (puVar42 < puVar1) {
                      if (*puVar47 == *puVar42) {
                        lVar29 = 0;
                        do {
                          puVar48 = (ulong *)((long)puVar22 + lVar29 + 9);
                          if (puVar1 <= puVar48) {
                            puVar47 = (ulong *)(pBVar30 + lVar29 + uVar39 + 8);
                            goto LAB_006dd7de;
                          }
                          lVar15 = lVar29 + uVar39 + 8;
                          lVar29 = lVar29 + 8;
                        } while (*(ulong *)(pBVar30 + lVar15) == *puVar48);
                        uVar36 = *puVar48 ^ *(ulong *)(pBVar30 + lVar15);
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar29;
                      }
                      else {
                        uVar36 = *puVar42 ^ *puVar47;
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = uVar39 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_006dd7de:
                      if ((puVar48 < puVar2) && ((int)*puVar47 == (int)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 4);
                        puVar47 = (ulong *)((long)puVar47 + 4);
                      }
                      if ((puVar48 < puVar3) && ((short)*puVar47 == (short)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 2);
                        puVar47 = (ulong *)((long)puVar47 + 2);
                      }
                      if (puVar48 < iEnd) {
                        puVar48 = (ulong *)((long)puVar48 +
                                           (ulong)((BYTE)*puVar47 == (BYTE)*puVar48));
                      }
                      uVar39 = (long)puVar48 - (long)puVar42;
                    }
                    goto LAB_006dd824;
                  }
                }
                lVar46 = lVar46 + 1;
              } while (lVar46 != lVar37);
            }
            else if (uVar27 == 5) {
              pUVar11 = ms->hashTable;
              pUVar12 = ms->tagTable;
              pBVar30 = (ms->window).base;
              uVar41 = (long)puVar42 - (long)pBVar30;
              uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar40 = (ms->window).lowLimit;
              uVar44 = (uint)uVar41;
              uVar27 = uVar44 - uVar31;
              if (uVar44 - uVar40 <= uVar31) {
                uVar27 = uVar40;
              }
              pBVar23 = (ms->window).dictBase;
              uVar31 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar27 = uVar40;
              }
              uVar39 = (ulong)ms->nextToUpdate;
              bVar25 = 0x38 - (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar44) {
                do {
                  uVar45 = (uint)uVar39 & 7;
                  uVar40 = ms->hashCache[uVar45];
                  ms->hashCache[uVar45] =
                       (U32)((ulong)(*(long *)(pBVar30 + uVar39 + 8) * -0x30e4432345000000) >>
                            (bVar25 & 0x3f));
                  uVar36 = (ulong)(uVar40 >> 4 & 0xfffffff0);
                  uVar45 = (byte)((char)pUVar12[uVar36] - 1) & 0xf;
                  *(char *)(pUVar12 + uVar36) = (char)uVar45;
                  *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar36 * 2) = (char)uVar40;
                  pUVar11[uVar36 + uVar45] = (uint)uVar39;
                  uVar39 = uVar39 + 1;
                } while (uVar39 < (uVar41 & 0xffffffff));
              }
              ms->nextToUpdate = uVar44;
              uVar40 = ms->hashCache[uVar44 & 7];
              ms->hashCache[uVar44 & 7] =
                   (U32)((ulong)(*(long *)(pBVar30 + (uVar41 & 0xffffffff) + 8) *
                                -0x30e4432345000000) >> (bVar25 & 0x3f));
              uVar41 = (ulong)(uVar40 >> 4 & 0xfffffff0);
              bVar25 = (byte)pUVar12[uVar41];
              pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
              uVar89 = (undefined1)(uVar40 >> 0x18);
              uVar87 = (undefined1)(uVar40 >> 0x10);
              uVar85 = (undefined1)(uVar40 >> 8);
              auVar71._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40))
                        >> 0x20);
              auVar71[3] = uVar85;
              auVar71[2] = uVar85;
              auVar71[0] = (undefined1)uVar40;
              auVar71[1] = auVar71[0];
              auVar71._8_8_ = 0;
              auVar92 = pshuflw(auVar71,auVar71,0);
              cVar58 = auVar92[0];
              auVar72[0] = -(cVar58 == *pcVar6);
              cVar86 = auVar92[1];
              auVar72[1] = -(cVar86 == pcVar6[1]);
              cVar88 = auVar92[2];
              auVar72[2] = -(cVar88 == pcVar6[2]);
              cVar90 = auVar92[3];
              auVar72[3] = -(cVar90 == pcVar6[3]);
              auVar72[4] = -(cVar58 == pcVar6[4]);
              auVar72[5] = -(cVar86 == pcVar6[5]);
              auVar72[6] = -(cVar88 == pcVar6[6]);
              auVar72[7] = -(cVar90 == pcVar6[7]);
              auVar72[8] = -(cVar58 == pcVar6[8]);
              auVar72[9] = -(cVar86 == pcVar6[9]);
              auVar72[10] = -(cVar88 == pcVar6[10]);
              auVar72[0xb] = -(cVar90 == pcVar6[0xb]);
              auVar72[0xc] = -(cVar58 == pcVar6[0xc]);
              auVar72[0xd] = -(cVar86 == pcVar6[0xd]);
              auVar72[0xe] = -(cVar88 == pcVar6[0xe]);
              auVar72[0xf] = -(cVar90 == pcVar6[0xf]);
              uVar13 = (ushort)(SUB161(auVar72 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar72[0xf] >> 7) << 0xf;
              uVar40 = (uint)uVar13;
              if ((bVar25 & 0xf) != 0) {
                uVar40 = (uint)uVar13 << (0x10 - (bVar25 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar13 >> (bVar25 & 0xf));
              }
              if (uVar40 == 0) {
                lVar37 = 0;
              }
              else {
                lVar46 = 0;
                while( true ) {
                  iVar28 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
                    }
                  }
                  lVar37 = lVar46;
                  if (pUVar11[uVar41 + (iVar28 + (uint)bVar25 & 0xf)] < uVar27) break;
                  lVar37 = lVar46 + 1;
                  auStack_c8[lVar46] = pUVar11[uVar41 + (iVar28 + (uint)bVar25 & 0xf)];
                  uVar40 = uVar40 & uVar40 - 1;
                  if ((uVar40 == 0) ||
                     (iVar28 = (int)lVar46, lVar46 = lVar37, (1 << (bVar24 & 0x1f)) + -1 == iVar28))
                  break;
                }
              }
              uVar40 = bVar25 - 1 & 0xf;
              *(char *)(pUVar12 + uVar41) = (char)uVar40;
              *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar71[0];
              UVar35 = ms->nextToUpdate;
              ms->nextToUpdate = UVar35 + 1;
              pUVar11[uVar41 + uVar40] = UVar35;
              if (lVar37 == 0) {
LAB_006df07f:
                local_1d0 = 999999999;
                uVar41 = 3;
              }
              else {
                local_1d0 = 999999999;
                uVar39 = 3;
                lVar46 = 0;
                do {
                  uVar40 = auStack_c8[lVar46];
                  uVar41 = (ulong)uVar40;
                  if (uVar40 < uVar31) {
                    if (*(int *)(pBVar23 + uVar41) == *(int *)puVar42) {
                      sVar21 = ZSTD_count_2segments
                                         ((BYTE *)((long)puVar22 + 5),pBVar23 + uVar41 + 4,
                                          (BYTE *)iEnd,pBVar23 + uVar31,pBVar30 + uVar31);
                      uVar41 = sVar21 + 4;
LAB_006ddc1f:
                      if ((uVar39 < uVar41) &&
                         (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar39 = uVar41,
                         (ulong *)((long)puVar42 + uVar41) == iEnd)) break;
                    }
                  }
                  else {
                    puVar47 = (ulong *)(pBVar30 + uVar41);
                    if (*(BYTE *)(uVar39 + (long)puVar47) == *(BYTE *)((long)puVar42 + uVar39)) {
                      puVar48 = puVar42;
                      if (puVar42 < puVar1) {
                        if (*puVar47 == *puVar42) {
                          lVar29 = 0;
                          do {
                            puVar48 = (ulong *)((long)puVar22 + lVar29 + 9);
                            if (puVar1 <= puVar48) {
                              puVar47 = (ulong *)(pBVar30 + lVar29 + uVar41 + 8);
                              goto LAB_006ddbd9;
                            }
                            lVar15 = lVar29 + uVar41 + 8;
                            lVar29 = lVar29 + 8;
                          } while (*(ulong *)(pBVar30 + lVar15) == *puVar48);
                          uVar36 = *puVar48 ^ *(ulong *)(pBVar30 + lVar15);
                          uVar41 = 0;
                          if (uVar36 != 0) {
                            for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                            }
                          }
                          uVar41 = (uVar41 >> 3 & 0x1fffffff) + lVar29;
                        }
                        else {
                          uVar36 = *puVar42 ^ *puVar47;
                          uVar41 = 0;
                          if (uVar36 != 0) {
                            for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                            }
                          }
                          uVar41 = uVar41 >> 3 & 0x1fffffff;
                        }
                      }
                      else {
LAB_006ddbd9:
                        if ((puVar48 < puVar2) && ((int)*puVar47 == (int)*puVar48)) {
                          puVar48 = (ulong *)((long)puVar48 + 4);
                          puVar47 = (ulong *)((long)puVar47 + 4);
                        }
                        if ((puVar48 < puVar3) && ((short)*puVar47 == (short)*puVar48)) {
                          puVar48 = (ulong *)((long)puVar48 + 2);
                          puVar47 = (ulong *)((long)puVar47 + 2);
                        }
                        if (puVar48 < iEnd) {
                          puVar48 = (ulong *)((long)puVar48 +
                                             (ulong)((BYTE)*puVar47 == (BYTE)*puVar48));
                        }
                        uVar41 = (long)puVar48 - (long)puVar42;
                      }
                      goto LAB_006ddc1f;
                    }
                  }
                  lVar46 = lVar46 + 1;
                  uVar41 = uVar39;
                } while (lVar46 != lVar37);
              }
            }
            else {
              pUVar11 = ms->hashTable;
              pUVar12 = ms->tagTable;
              pBVar30 = (ms->window).base;
              uVar41 = (long)puVar42 - (long)pBVar30;
              uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar40 = (ms->window).lowLimit;
              uVar44 = (uint)uVar41;
              uVar27 = uVar44 - uVar31;
              if (uVar44 - uVar40 <= uVar31) {
                uVar27 = uVar40;
              }
              pBVar23 = (ms->window).dictBase;
              uVar31 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar27 = uVar40;
              }
              uVar39 = (ulong)ms->nextToUpdate;
              bVar25 = 0x18 - (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar44) {
                do {
                  uVar45 = (uint)uVar39 & 7;
                  uVar40 = ms->hashCache[uVar45];
                  ms->hashCache[uVar45] =
                       (uint)(*(int *)(pBVar30 + uVar39 + 8) * -0x61c8864f) >> (bVar25 & 0x1f);
                  uVar36 = (ulong)(uVar40 >> 4 & 0xfffffff0);
                  uVar45 = (byte)((char)pUVar12[uVar36] - 1) & 0xf;
                  *(char *)(pUVar12 + uVar36) = (char)uVar45;
                  *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar36 * 2) = (char)uVar40;
                  pUVar11[uVar36 + uVar45] = (uint)uVar39;
                  uVar39 = uVar39 + 1;
                } while (uVar39 < (uVar41 & 0xffffffff));
              }
              ms->nextToUpdate = uVar44;
              uVar40 = ms->hashCache[uVar44 & 7];
              ms->hashCache[uVar44 & 7] =
                   (uint)(*(int *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x61c8864f) >>
                   (bVar25 & 0x1f);
              uVar41 = (ulong)(uVar40 >> 4 & 0xfffffff0);
              bVar25 = (byte)pUVar12[uVar41];
              pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
              uVar89 = (undefined1)(uVar40 >> 0x18);
              uVar87 = (undefined1)(uVar40 >> 0x10);
              uVar85 = (undefined1)(uVar40 >> 8);
              auVar74._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40))
                        >> 0x20);
              auVar74[3] = uVar85;
              auVar74[2] = uVar85;
              auVar74[0] = (undefined1)uVar40;
              auVar74[1] = auVar74[0];
              auVar74._8_8_ = 0;
              auVar92 = pshuflw(auVar74,auVar74,0);
              cVar58 = auVar92[0];
              auVar75[0] = -(cVar58 == *pcVar6);
              cVar86 = auVar92[1];
              auVar75[1] = -(cVar86 == pcVar6[1]);
              cVar88 = auVar92[2];
              auVar75[2] = -(cVar88 == pcVar6[2]);
              cVar90 = auVar92[3];
              auVar75[3] = -(cVar90 == pcVar6[3]);
              auVar75[4] = -(cVar58 == pcVar6[4]);
              auVar75[5] = -(cVar86 == pcVar6[5]);
              auVar75[6] = -(cVar88 == pcVar6[6]);
              auVar75[7] = -(cVar90 == pcVar6[7]);
              auVar75[8] = -(cVar58 == pcVar6[8]);
              auVar75[9] = -(cVar86 == pcVar6[9]);
              auVar75[10] = -(cVar88 == pcVar6[10]);
              auVar75[0xb] = -(cVar90 == pcVar6[0xb]);
              auVar75[0xc] = -(cVar58 == pcVar6[0xc]);
              auVar75[0xd] = -(cVar86 == pcVar6[0xd]);
              auVar75[0xe] = -(cVar88 == pcVar6[0xe]);
              auVar75[0xf] = -(cVar90 == pcVar6[0xf]);
              uVar13 = (ushort)(SUB161(auVar75 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar75[0xf] >> 7) << 0xf;
              uVar40 = (uint)uVar13;
              if ((bVar25 & 0xf) != 0) {
                uVar40 = (uint)uVar13 << (0x10 - (bVar25 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar13 >> (bVar25 & 0xf));
              }
              if (uVar40 == 0) {
                lVar37 = 0;
              }
              else {
                lVar46 = 0;
                while( true ) {
                  iVar28 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
                    }
                  }
                  lVar37 = lVar46;
                  if (pUVar11[uVar41 + (iVar28 + (uint)bVar25 & 0xf)] < uVar27) break;
                  lVar37 = lVar46 + 1;
                  auStack_c8[lVar46] = pUVar11[uVar41 + (iVar28 + (uint)bVar25 & 0xf)];
                  uVar40 = uVar40 & uVar40 - 1;
                  if ((uVar40 == 0) ||
                     (iVar28 = (int)lVar46, lVar46 = lVar37,
                     (int)(1L << (bVar24 & 0x3f)) + -1 == iVar28)) break;
                }
              }
              uVar40 = bVar25 - 1 & 0xf;
              *(char *)(pUVar12 + uVar41) = (char)uVar40;
              *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar74[0];
              UVar35 = ms->nextToUpdate;
              ms->nextToUpdate = UVar35 + 1;
              pUVar11[uVar41 + uVar40] = UVar35;
              if (lVar37 == 0) goto LAB_006df07f;
              local_1d0 = 999999999;
              uVar39 = 3;
              lVar46 = 0;
              do {
                uVar40 = auStack_c8[lVar46];
                uVar41 = (ulong)uVar40;
                if (uVar40 < uVar31) {
                  if (*(int *)(pBVar23 + uVar41) == *(int *)puVar42) {
                    sVar21 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar22 + 5),pBVar23 + uVar41 + 4,
                                        (BYTE *)iEnd,pBVar23 + uVar31,pBVar30 + uVar31);
                    uVar41 = sVar21 + 4;
LAB_006df048:
                    if ((uVar39 < uVar41) &&
                       (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar39 = uVar41,
                       (ulong *)((long)puVar42 + uVar41) == iEnd)) break;
                  }
                }
                else {
                  puVar47 = (ulong *)(pBVar30 + uVar41);
                  if (*(BYTE *)(uVar39 + (long)puVar47) == *(BYTE *)((long)puVar42 + uVar39)) {
                    puVar48 = puVar42;
                    if (puVar42 < puVar1) {
                      if (*puVar47 == *puVar42) {
                        lVar29 = 0;
                        do {
                          puVar48 = (ulong *)((long)puVar22 + lVar29 + 9);
                          if (puVar1 <= puVar48) {
                            puVar47 = (ulong *)(pBVar30 + lVar29 + uVar41 + 8);
                            goto LAB_006df002;
                          }
                          lVar15 = lVar29 + uVar41 + 8;
                          lVar29 = lVar29 + 8;
                        } while (*(ulong *)(pBVar30 + lVar15) == *puVar48);
                        uVar36 = *puVar48 ^ *(ulong *)(pBVar30 + lVar15);
                        uVar41 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                          }
                        }
                        uVar41 = (uVar41 >> 3 & 0x1fffffff) + lVar29;
                      }
                      else {
                        uVar36 = *puVar42 ^ *puVar47;
                        uVar41 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                          }
                        }
                        uVar41 = uVar41 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_006df002:
                      if ((puVar48 < puVar2) && ((int)*puVar47 == (int)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 4);
                        puVar47 = (ulong *)((long)puVar47 + 4);
                      }
                      if ((puVar48 < puVar3) && ((short)*puVar47 == (short)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 2);
                        puVar47 = (ulong *)((long)puVar47 + 2);
                      }
                      if (puVar48 < iEnd) {
                        puVar48 = (ulong *)((long)puVar48 +
                                           (ulong)((BYTE)*puVar47 == (BYTE)*puVar48));
                      }
                      uVar41 = (long)puVar48 - (long)puVar42;
                    }
                    goto LAB_006df048;
                  }
                }
                lVar46 = lVar46 + 1;
                uVar41 = uVar39;
              } while (lVar46 != lVar37);
            }
          }
          else if (uVar27 - 6 < 2) {
            pUVar11 = ms->hashTable;
            pBVar30 = (ms->window).base;
            uVar41 = (long)puVar42 - (long)pBVar30;
            uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar40 = (ms->window).lowLimit;
            uVar44 = (uint)uVar41;
            uVar27 = uVar44 - uVar31;
            if (uVar44 - uVar40 <= uVar31) {
              uVar27 = uVar40;
            }
            pUVar12 = ms->tagTable;
            pBVar23 = (ms->window).dictBase;
            uVar31 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar27 = uVar40;
            }
            uVar39 = (ulong)ms->nextToUpdate;
            bVar24 = 0x38 - (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar44) {
              do {
                uVar45 = (uint)uVar39 & 7;
                uVar40 = ms->hashCache[uVar45];
                ms->hashCache[uVar45] =
                     (U32)((ulong)(*(long *)(pBVar30 + uVar39 + 8) * -0x30e4432340650000) >>
                          (bVar24 & 0x3f));
                uVar36 = (ulong)(uVar40 >> 3 & 0xffffffe0);
                uVar45 = (byte)((char)pUVar12[uVar36] - 1) & 0x1f;
                *(char *)(pUVar12 + uVar36) = (char)uVar45;
                *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar36 * 2) = (char)uVar40;
                pUVar11[uVar36 + uVar45] = (uint)uVar39;
                uVar39 = uVar39 + 1;
              } while (uVar39 < (uVar41 & 0xffffffff));
            }
            ms->nextToUpdate = uVar44;
            uVar40 = ms->hashCache[uVar44 & 7];
            ms->hashCache[uVar44 & 7] =
                 (U32)((ulong)(*(long *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x30e4432340650000)
                      >> (bVar24 & 0x3f));
            uVar41 = (ulong)(uVar40 >> 3 & 0xffffffe0);
            bVar24 = (byte)pUVar12[uVar41];
            pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
            pcVar7 = (char *)((long)pUVar12 + uVar41 * 2 + 0x11);
            uVar89 = (undefined1)(uVar40 >> 0x18);
            uVar87 = (undefined1)(uVar40 >> 0x10);
            uVar85 = (undefined1)(uVar40 >> 8);
            auVar95._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40)) >>
                      0x20);
            auVar95[3] = uVar85;
            auVar95[2] = uVar85;
            auVar95[0] = (undefined1)uVar40;
            auVar95[1] = auVar95[0];
            auVar95._8_8_ = 0;
            auVar92 = pshuflw(auVar95,auVar95,0);
            cVar58 = auVar92[0];
            auVar52[0] = -(*pcVar6 == cVar58);
            cVar86 = auVar92[1];
            auVar52[1] = -(pcVar6[1] == cVar86);
            cVar88 = auVar92[2];
            auVar52[2] = -(pcVar6[2] == cVar88);
            cVar90 = auVar92[3];
            auVar52[3] = -(pcVar6[3] == cVar90);
            auVar52[4] = -(pcVar6[4] == cVar58);
            auVar52[5] = -(pcVar6[5] == cVar86);
            auVar52[6] = -(pcVar6[6] == cVar88);
            auVar52[7] = -(pcVar6[7] == cVar90);
            auVar52[8] = -(pcVar6[8] == cVar58);
            auVar52[9] = -(pcVar6[9] == cVar86);
            auVar52[10] = -(pcVar6[10] == cVar88);
            auVar52[0xb] = -(pcVar6[0xb] == cVar90);
            auVar52[0xc] = -(pcVar6[0xc] == cVar58);
            auVar52[0xd] = -(pcVar6[0xd] == cVar86);
            auVar52[0xe] = -(pcVar6[0xe] == cVar88);
            auVar52[0xf] = -(pcVar6[0xf] == cVar90);
            auVar67[0] = -(*pcVar7 == cVar58);
            auVar67[1] = -(pcVar7[1] == cVar86);
            auVar67[2] = -(pcVar7[2] == cVar88);
            auVar67[3] = -(pcVar7[3] == cVar90);
            auVar67[4] = -(pcVar7[4] == cVar58);
            auVar67[5] = -(pcVar7[5] == cVar86);
            auVar67[6] = -(pcVar7[6] == cVar88);
            auVar67[7] = -(pcVar7[7] == cVar90);
            auVar67[8] = -(pcVar7[8] == cVar58);
            auVar67[9] = -(pcVar7[9] == cVar86);
            auVar67[10] = -(pcVar7[10] == cVar88);
            auVar67[0xb] = -(pcVar7[0xb] == cVar90);
            auVar67[0xc] = -(pcVar7[0xc] == cVar58);
            auVar67[0xd] = -(pcVar7[0xd] == cVar86);
            auVar67[0xe] = -(pcVar7[0xe] == cVar88);
            auVar67[0xf] = -(pcVar7[0xf] == cVar90);
            uVar45 = CONCAT22((ushort)(SUB161(auVar67 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar67[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar52 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar52[0xf] >> 7) << 0xf);
            uVar40 = uVar45 >> (bVar24 & 0x1f) | uVar45 << 0x20 - (bVar24 & 0x1f);
            if ((bVar24 & 0x1f) == 0) {
              uVar40 = uVar45;
            }
            if (uVar40 == 0) {
              lVar37 = 0;
            }
            else {
              lVar46 = 0;
              while( true ) {
                iVar28 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
                  }
                }
                lVar37 = lVar46;
                if (pUVar11[uVar41 + (iVar28 + (uint)bVar24 & 0x1f)] < uVar27) break;
                lVar37 = lVar46 + 1;
                auStack_c8[lVar46] = pUVar11[uVar41 + (iVar28 + (uint)bVar24 & 0x1f)];
                uVar40 = uVar40 & uVar40 - 1;
                if ((uVar40 == 0) || (iVar28 = (int)lVar46, lVar46 = lVar37, iVar28 == 0x1f)) break;
              }
            }
            uVar40 = bVar24 - 1 & 0x1f;
            *(char *)(pUVar12 + uVar41) = (char)uVar40;
            *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar95[0];
            UVar35 = ms->nextToUpdate;
            ms->nextToUpdate = UVar35 + 1;
            pUVar11[uVar41 + uVar40] = UVar35;
            if (lVar37 == 0) goto LAB_006dde1c;
            local_1d0 = 999999999;
            uVar41 = 3;
            lVar46 = 0;
            do {
              uVar40 = auStack_c8[lVar46];
              uVar39 = (ulong)uVar40;
              if (uVar40 < uVar31) {
                if (*(int *)(pBVar23 + uVar39) == *(int *)puVar42) {
                  sVar21 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar22 + 5),pBVar23 + uVar39 + 4,(BYTE *)iEnd,
                                      pBVar23 + uVar31,pBVar30 + uVar31);
                  uVar39 = sVar21 + 4;
LAB_006dd651:
                  if ((uVar41 < uVar39) &&
                     (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar39,
                     (ulong *)((long)puVar42 + uVar39) == iEnd)) break;
                }
              }
              else {
                puVar47 = (ulong *)(pBVar30 + uVar39);
                if (*(BYTE *)(uVar41 + (long)puVar47) == *(BYTE *)((long)puVar42 + uVar41)) {
                  puVar48 = puVar42;
                  if (puVar42 < puVar1) {
                    if (*puVar47 == *puVar42) {
                      lVar29 = 0;
                      do {
                        puVar48 = (ulong *)((long)puVar22 + lVar29 + 9);
                        if (puVar1 <= puVar48) {
                          puVar47 = (ulong *)(pBVar30 + lVar29 + uVar39 + 8);
                          goto LAB_006dd60b;
                        }
                        lVar15 = lVar29 + uVar39 + 8;
                        lVar29 = lVar29 + 8;
                      } while (*(ulong *)(pBVar30 + lVar15) == *puVar48);
                      uVar36 = *puVar48 ^ *(ulong *)(pBVar30 + lVar15);
                      uVar39 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar29;
                    }
                    else {
                      uVar36 = *puVar42 ^ *puVar47;
                      uVar39 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      uVar39 = uVar39 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_006dd60b:
                    if ((puVar48 < puVar2) && ((int)*puVar47 == (int)*puVar48)) {
                      puVar48 = (ulong *)((long)puVar48 + 4);
                      puVar47 = (ulong *)((long)puVar47 + 4);
                    }
                    if ((puVar48 < puVar3) && ((short)*puVar47 == (short)*puVar48)) {
                      puVar48 = (ulong *)((long)puVar48 + 2);
                      puVar47 = (ulong *)((long)puVar47 + 2);
                    }
                    if (puVar48 < iEnd) {
                      puVar48 = (ulong *)((long)puVar48 + (ulong)((BYTE)*puVar47 == (BYTE)*puVar48))
                      ;
                    }
                    uVar39 = (long)puVar48 - (long)puVar42;
                  }
                  goto LAB_006dd651;
                }
              }
              lVar46 = lVar46 + 1;
            } while (lVar46 != lVar37);
          }
          else if (uVar27 == 5) {
            pUVar11 = ms->hashTable;
            pBVar30 = (ms->window).base;
            uVar41 = (long)puVar42 - (long)pBVar30;
            uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar40 = (ms->window).lowLimit;
            uVar44 = (uint)uVar41;
            uVar27 = uVar44 - uVar31;
            if (uVar44 - uVar40 <= uVar31) {
              uVar27 = uVar40;
            }
            pUVar12 = ms->tagTable;
            pBVar23 = (ms->window).dictBase;
            uVar31 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar27 = uVar40;
            }
            uVar39 = (ulong)ms->nextToUpdate;
            bVar24 = 0x38 - (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar44) {
              do {
                uVar45 = (uint)uVar39 & 7;
                uVar40 = ms->hashCache[uVar45];
                ms->hashCache[uVar45] =
                     (U32)((ulong)(*(long *)(pBVar30 + uVar39 + 8) * -0x30e4432345000000) >>
                          (bVar24 & 0x3f));
                uVar36 = (ulong)(uVar40 >> 3 & 0xffffffe0);
                uVar45 = (byte)((char)pUVar12[uVar36] - 1) & 0x1f;
                *(char *)(pUVar12 + uVar36) = (char)uVar45;
                *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar36 * 2) = (char)uVar40;
                pUVar11[uVar36 + uVar45] = (uint)uVar39;
                uVar39 = uVar39 + 1;
              } while (uVar39 < (uVar41 & 0xffffffff));
            }
            ms->nextToUpdate = uVar44;
            uVar40 = ms->hashCache[uVar44 & 7];
            ms->hashCache[uVar44 & 7] =
                 (U32)((ulong)(*(long *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x30e4432345000000)
                      >> (bVar24 & 0x3f));
            uVar41 = (ulong)(uVar40 >> 3 & 0xffffffe0);
            bVar24 = (byte)pUVar12[uVar41];
            pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
            pcVar7 = (char *)((long)pUVar12 + uVar41 * 2 + 0x11);
            uVar89 = (undefined1)(uVar40 >> 0x18);
            uVar87 = (undefined1)(uVar40 >> 0x10);
            uVar85 = (undefined1)(uVar40 >> 8);
            auVar96._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40)) >>
                      0x20);
            auVar96[3] = uVar85;
            auVar96[2] = uVar85;
            auVar96[0] = (undefined1)uVar40;
            auVar96[1] = auVar96[0];
            auVar96._8_8_ = 0;
            auVar92 = pshuflw(auVar96,auVar96,0);
            cVar58 = auVar92[0];
            auVar53[0] = -(*pcVar6 == cVar58);
            cVar86 = auVar92[1];
            auVar53[1] = -(pcVar6[1] == cVar86);
            cVar88 = auVar92[2];
            auVar53[2] = -(pcVar6[2] == cVar88);
            cVar90 = auVar92[3];
            auVar53[3] = -(pcVar6[3] == cVar90);
            auVar53[4] = -(pcVar6[4] == cVar58);
            auVar53[5] = -(pcVar6[5] == cVar86);
            auVar53[6] = -(pcVar6[6] == cVar88);
            auVar53[7] = -(pcVar6[7] == cVar90);
            auVar53[8] = -(pcVar6[8] == cVar58);
            auVar53[9] = -(pcVar6[9] == cVar86);
            auVar53[10] = -(pcVar6[10] == cVar88);
            auVar53[0xb] = -(pcVar6[0xb] == cVar90);
            auVar53[0xc] = -(pcVar6[0xc] == cVar58);
            auVar53[0xd] = -(pcVar6[0xd] == cVar86);
            auVar53[0xe] = -(pcVar6[0xe] == cVar88);
            auVar53[0xf] = -(pcVar6[0xf] == cVar90);
            auVar70[0] = -(*pcVar7 == cVar58);
            auVar70[1] = -(pcVar7[1] == cVar86);
            auVar70[2] = -(pcVar7[2] == cVar88);
            auVar70[3] = -(pcVar7[3] == cVar90);
            auVar70[4] = -(pcVar7[4] == cVar58);
            auVar70[5] = -(pcVar7[5] == cVar86);
            auVar70[6] = -(pcVar7[6] == cVar88);
            auVar70[7] = -(pcVar7[7] == cVar90);
            auVar70[8] = -(pcVar7[8] == cVar58);
            auVar70[9] = -(pcVar7[9] == cVar86);
            auVar70[10] = -(pcVar7[10] == cVar88);
            auVar70[0xb] = -(pcVar7[0xb] == cVar90);
            auVar70[0xc] = -(pcVar7[0xc] == cVar58);
            auVar70[0xd] = -(pcVar7[0xd] == cVar86);
            auVar70[0xe] = -(pcVar7[0xe] == cVar88);
            auVar70[0xf] = -(pcVar7[0xf] == cVar90);
            uVar45 = CONCAT22((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar70[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar53 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar53[0xf] >> 7) << 0xf);
            uVar40 = uVar45 >> (bVar24 & 0x1f) | uVar45 << 0x20 - (bVar24 & 0x1f);
            if ((bVar24 & 0x1f) == 0) {
              uVar40 = uVar45;
            }
            if (uVar40 == 0) {
              lVar37 = 0;
            }
            else {
              lVar46 = 0;
              while( true ) {
                iVar28 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
                  }
                }
                lVar37 = lVar46;
                if (pUVar11[uVar41 + (iVar28 + (uint)bVar24 & 0x1f)] < uVar27) break;
                lVar37 = lVar46 + 1;
                auStack_c8[lVar46] = pUVar11[uVar41 + (iVar28 + (uint)bVar24 & 0x1f)];
                uVar40 = uVar40 & uVar40 - 1;
                if ((uVar40 == 0) || (iVar28 = (int)lVar46, lVar46 = lVar37, iVar28 == 0x1f)) break;
              }
            }
            uVar40 = bVar24 - 1 & 0x1f;
            *(char *)(pUVar12 + uVar41) = (char)uVar40;
            *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar96[0];
            UVar35 = ms->nextToUpdate;
            ms->nextToUpdate = UVar35 + 1;
            pUVar11[uVar41 + uVar40] = UVar35;
            if (lVar37 == 0) {
LAB_006dde1c:
              local_1d0 = 999999999;
              uVar41 = 3;
            }
            else {
              local_1d0 = 999999999;
              uVar41 = 3;
              lVar46 = 0;
              do {
                uVar40 = auStack_c8[lVar46];
                uVar39 = (ulong)uVar40;
                if (uVar40 < uVar31) {
                  if (*(int *)(pBVar23 + uVar39) == *(int *)puVar42) {
                    sVar21 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar22 + 5),pBVar23 + uVar39 + 4,
                                        (BYTE *)iEnd,pBVar23 + uVar31,pBVar30 + uVar31);
                    uVar39 = sVar21 + 4;
LAB_006dda47:
                    if ((uVar41 < uVar39) &&
                       (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar39,
                       (ulong *)((long)puVar42 + uVar39) == iEnd)) break;
                  }
                }
                else {
                  puVar47 = (ulong *)(pBVar30 + uVar39);
                  if (*(BYTE *)(uVar41 + (long)puVar47) == *(BYTE *)((long)puVar42 + uVar41)) {
                    puVar48 = puVar42;
                    if (puVar42 < puVar1) {
                      if (*puVar47 == *puVar42) {
                        lVar29 = 0;
                        do {
                          puVar48 = (ulong *)((long)puVar22 + lVar29 + 9);
                          if (puVar1 <= puVar48) {
                            puVar47 = (ulong *)(pBVar30 + lVar29 + uVar39 + 8);
                            goto LAB_006dda01;
                          }
                          lVar15 = lVar29 + uVar39 + 8;
                          lVar29 = lVar29 + 8;
                        } while (*(ulong *)(pBVar30 + lVar15) == *puVar48);
                        uVar36 = *puVar48 ^ *(ulong *)(pBVar30 + lVar15);
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar29;
                      }
                      else {
                        uVar36 = *puVar42 ^ *puVar47;
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = uVar39 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_006dda01:
                      if ((puVar48 < puVar2) && ((int)*puVar47 == (int)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 4);
                        puVar47 = (ulong *)((long)puVar47 + 4);
                      }
                      if ((puVar48 < puVar3) && ((short)*puVar47 == (short)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 2);
                        puVar47 = (ulong *)((long)puVar47 + 2);
                      }
                      if (puVar48 < iEnd) {
                        puVar48 = (ulong *)((long)puVar48 +
                                           (ulong)((BYTE)*puVar47 == (BYTE)*puVar48));
                      }
                      uVar39 = (long)puVar48 - (long)puVar42;
                    }
                    goto LAB_006dda47;
                  }
                }
                lVar46 = lVar46 + 1;
              } while (lVar46 != lVar37);
            }
          }
          else {
            pUVar11 = ms->hashTable;
            pBVar30 = (ms->window).base;
            uVar41 = (long)puVar42 - (long)pBVar30;
            uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar40 = (ms->window).lowLimit;
            uVar44 = (uint)uVar41;
            uVar27 = uVar44 - uVar31;
            if (uVar44 - uVar40 <= uVar31) {
              uVar27 = uVar40;
            }
            pUVar12 = ms->tagTable;
            pBVar23 = (ms->window).dictBase;
            uVar31 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar27 = uVar40;
            }
            uVar39 = (ulong)ms->nextToUpdate;
            bVar24 = 0x18 - (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar44) {
              do {
                uVar45 = (uint)uVar39 & 7;
                uVar40 = ms->hashCache[uVar45];
                ms->hashCache[uVar45] =
                     (uint)(*(int *)(pBVar30 + uVar39 + 8) * -0x61c8864f) >> (bVar24 & 0x1f);
                uVar36 = (ulong)(uVar40 >> 3 & 0xffffffe0);
                uVar45 = (byte)((char)pUVar12[uVar36] - 1) & 0x1f;
                *(char *)(pUVar12 + uVar36) = (char)uVar45;
                *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar36 * 2) = (char)uVar40;
                pUVar11[uVar36 + uVar45] = (uint)uVar39;
                uVar39 = uVar39 + 1;
              } while (uVar39 < (uVar41 & 0xffffffff));
            }
            ms->nextToUpdate = uVar44;
            uVar40 = ms->hashCache[uVar44 & 7];
            ms->hashCache[uVar44 & 7] =
                 (uint)(*(int *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x61c8864f) >>
                 (bVar24 & 0x1f);
            uVar41 = (ulong)(uVar40 >> 3 & 0xffffffe0);
            bVar24 = (byte)pUVar12[uVar41];
            pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
            pcVar7 = (char *)((long)pUVar12 + uVar41 * 2 + 0x11);
            uVar89 = (undefined1)(uVar40 >> 0x18);
            uVar87 = (undefined1)(uVar40 >> 0x10);
            uVar85 = (undefined1)(uVar40 >> 8);
            auVar97._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40)) >>
                      0x20);
            auVar97[3] = uVar85;
            auVar97[2] = uVar85;
            auVar97[0] = (undefined1)uVar40;
            auVar97[1] = auVar97[0];
            auVar97._8_8_ = 0;
            auVar92 = pshuflw(auVar97,auVar97,0);
            cVar58 = auVar92[0];
            auVar54[0] = -(*pcVar6 == cVar58);
            cVar86 = auVar92[1];
            auVar54[1] = -(pcVar6[1] == cVar86);
            cVar88 = auVar92[2];
            auVar54[2] = -(pcVar6[2] == cVar88);
            cVar90 = auVar92[3];
            auVar54[3] = -(pcVar6[3] == cVar90);
            auVar54[4] = -(pcVar6[4] == cVar58);
            auVar54[5] = -(pcVar6[5] == cVar86);
            auVar54[6] = -(pcVar6[6] == cVar88);
            auVar54[7] = -(pcVar6[7] == cVar90);
            auVar54[8] = -(pcVar6[8] == cVar58);
            auVar54[9] = -(pcVar6[9] == cVar86);
            auVar54[10] = -(pcVar6[10] == cVar88);
            auVar54[0xb] = -(pcVar6[0xb] == cVar90);
            auVar54[0xc] = -(pcVar6[0xc] == cVar58);
            auVar54[0xd] = -(pcVar6[0xd] == cVar86);
            auVar54[0xe] = -(pcVar6[0xe] == cVar88);
            auVar54[0xf] = -(pcVar6[0xf] == cVar90);
            auVar73[0] = -(*pcVar7 == cVar58);
            auVar73[1] = -(pcVar7[1] == cVar86);
            auVar73[2] = -(pcVar7[2] == cVar88);
            auVar73[3] = -(pcVar7[3] == cVar90);
            auVar73[4] = -(pcVar7[4] == cVar58);
            auVar73[5] = -(pcVar7[5] == cVar86);
            auVar73[6] = -(pcVar7[6] == cVar88);
            auVar73[7] = -(pcVar7[7] == cVar90);
            auVar73[8] = -(pcVar7[8] == cVar58);
            auVar73[9] = -(pcVar7[9] == cVar86);
            auVar73[10] = -(pcVar7[10] == cVar88);
            auVar73[0xb] = -(pcVar7[0xb] == cVar90);
            auVar73[0xc] = -(pcVar7[0xc] == cVar58);
            auVar73[0xd] = -(pcVar7[0xd] == cVar86);
            auVar73[0xe] = -(pcVar7[0xe] == cVar88);
            auVar73[0xf] = -(pcVar7[0xf] == cVar90);
            uVar45 = CONCAT22((ushort)(SUB161(auVar73 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar73[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar54 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar54[0xf] >> 7) << 0xf);
            uVar40 = uVar45 >> (bVar24 & 0x1f) | uVar45 << 0x20 - (bVar24 & 0x1f);
            if ((bVar24 & 0x1f) == 0) {
              uVar40 = uVar45;
            }
            if (uVar40 == 0) {
              lVar37 = 0;
            }
            else {
              lVar46 = 0;
              while( true ) {
                iVar28 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
                  }
                }
                lVar37 = lVar46;
                if (pUVar11[uVar41 + (iVar28 + (uint)bVar24 & 0x1f)] < uVar27) break;
                lVar37 = lVar46 + 1;
                auStack_c8[lVar46] = pUVar11[uVar41 + (iVar28 + (uint)bVar24 & 0x1f)];
                uVar40 = uVar40 & uVar40 - 1;
                if ((uVar40 == 0) || (iVar28 = (int)lVar46, lVar46 = lVar37, iVar28 == 0x1f)) break;
              }
            }
            uVar40 = bVar24 - 1 & 0x1f;
            *(char *)(pUVar12 + uVar41) = (char)uVar40;
            *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar97[0];
            UVar35 = ms->nextToUpdate;
            ms->nextToUpdate = UVar35 + 1;
            pUVar11[uVar41 + uVar40] = UVar35;
            if (lVar37 == 0) goto LAB_006dde1c;
            local_1d0 = 999999999;
            uVar41 = 3;
            lVar46 = 0;
            do {
              uVar40 = auStack_c8[lVar46];
              uVar39 = (ulong)uVar40;
              if (uVar40 < uVar31) {
                if (*(int *)(pBVar23 + uVar39) == *(int *)puVar42) {
                  sVar21 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar22 + 5),pBVar23 + uVar39 + 4,(BYTE *)iEnd,
                                      pBVar23 + uVar31,pBVar30 + uVar31);
                  uVar39 = sVar21 + 4;
LAB_006dddee:
                  if ((uVar41 < uVar39) &&
                     (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar39,
                     (ulong *)((long)puVar42 + uVar39) == iEnd)) break;
                }
              }
              else {
                puVar47 = (ulong *)(pBVar30 + uVar39);
                if (*(BYTE *)(uVar41 + (long)puVar47) == *(BYTE *)((long)puVar42 + uVar41)) {
                  puVar48 = puVar42;
                  if (puVar42 < puVar1) {
                    if (*puVar47 == *puVar42) {
                      lVar29 = 0;
                      do {
                        puVar48 = (ulong *)((long)puVar22 + lVar29 + 9);
                        if (puVar1 <= puVar48) {
                          puVar47 = (ulong *)(pBVar30 + lVar29 + uVar39 + 8);
                          goto LAB_006ddda8;
                        }
                        lVar15 = lVar29 + uVar39 + 8;
                        lVar29 = lVar29 + 8;
                      } while (*(ulong *)(pBVar30 + lVar15) == *puVar48);
                      uVar36 = *puVar48 ^ *(ulong *)(pBVar30 + lVar15);
                      uVar39 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar29;
                    }
                    else {
                      uVar36 = *puVar42 ^ *puVar47;
                      uVar39 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      uVar39 = uVar39 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_006ddda8:
                    if ((puVar48 < puVar2) && ((int)*puVar47 == (int)*puVar48)) {
                      puVar48 = (ulong *)((long)puVar48 + 4);
                      puVar47 = (ulong *)((long)puVar47 + 4);
                    }
                    if ((puVar48 < puVar3) && ((short)*puVar47 == (short)*puVar48)) {
                      puVar48 = (ulong *)((long)puVar48 + 2);
                      puVar47 = (ulong *)((long)puVar47 + 2);
                    }
                    if (puVar48 < iEnd) {
                      puVar48 = (ulong *)((long)puVar48 + (ulong)((BYTE)*puVar47 == (BYTE)*puVar48))
                      ;
                    }
                    uVar39 = (long)puVar48 - (long)puVar42;
                  }
                  goto LAB_006dddee;
                }
              }
              lVar46 = lVar46 + 1;
            } while (lVar46 != lVar37);
          }
          if (3 < uVar41) {
            uVar27 = (int)uVar20 + 1;
            uVar40 = 0x1f;
            if (uVar27 != 0) {
              for (; uVar27 >> uVar40 == 0; uVar40 = uVar40 - 1) {
              }
            }
            uVar27 = (int)local_1d0 + 1;
            iVar28 = 0x1f;
            if (uVar27 != 0) {
              for (; uVar27 >> iVar28 == 0; iVar28 = iVar28 + -1) {
              }
            }
            puVar47 = puVar42;
            if ((int)((uVar40 ^ 0x1f) + (int)uVar38 * 4 + -0x1b) < (int)uVar41 * 4 - iVar28)
            goto LAB_006dc84c;
          }
          if (iLimit <= puVar42) break;
          puVar42 = (ulong *)((long)puVar22 + 2);
          iVar33 = iVar43 + 2;
          if (uVar20 == 0) {
            uVar20 = 0;
          }
          else {
            UVar35 = (ms->window).lowLimit;
            UVar26 = iVar33 - uVar17;
            if (iVar33 - UVar35 <= uVar17) {
              UVar26 = UVar35;
            }
            if (ms->loadedDictEnd != 0) {
              UVar26 = UVar35;
            }
            uVar40 = iVar33 - local_17c;
            pBVar30 = base_11;
            if (uVar40 < uVar8) {
              pBVar30 = pBVar10;
            }
            if (((2 < iVar18 - uVar40) && (local_17c < iVar33 - UVar26)) &&
               (*(int *)puVar42 == *(int *)(pBVar30 + uVar40))) {
              puVar47 = iEnd;
              if (uVar40 < uVar8) {
                puVar47 = puVar19;
              }
              sVar21 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar22 + 6),(BYTE *)((long)(pBVar30 + uVar40) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar47,iStart);
              if (sVar21 < 0xfffffffffffffffc) {
                uVar27 = (int)uVar20 + 1;
                uVar40 = 0x1f;
                if (uVar27 != 0) {
                  for (; uVar27 >> uVar40 == 0; uVar40 = uVar40 - 1) {
                  }
                }
                if ((int)((uVar40 ^ 0x1f) + (int)uVar38 * 4 + -0x1e) < (int)(sVar21 + 4) * 4) {
                  uVar20 = 0;
                  uVar38 = sVar21 + 4;
                  local_168 = puVar42;
                }
              }
            }
          }
          uVar40 = (ms->cParams).searchLog;
          uVar27 = (ms->cParams).minMatch;
          if (uVar40 < 5) {
            bVar24 = (byte)uVar40;
            if (uVar27 - 6 < 2) {
              pUVar11 = ms->hashTable;
              pUVar12 = ms->tagTable;
              pBVar30 = (ms->window).base;
              uVar41 = (long)puVar42 - (long)pBVar30;
              uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar40 = (ms->window).lowLimit;
              uVar44 = (uint)uVar41;
              uVar27 = uVar44 - uVar31;
              if (uVar44 - uVar40 <= uVar31) {
                uVar27 = uVar40;
              }
              pBVar23 = (ms->window).dictBase;
              uVar31 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar27 = uVar40;
              }
              uVar39 = (ulong)ms->nextToUpdate;
              bVar25 = 0x38 - (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar44) {
                do {
                  uVar45 = (uint)uVar39 & 7;
                  uVar40 = ms->hashCache[uVar45];
                  ms->hashCache[uVar45] =
                       (U32)((ulong)(*(long *)(pBVar30 + uVar39 + 8) * -0x30e4432340650000) >>
                            (bVar25 & 0x3f));
                  uVar36 = (ulong)(uVar40 >> 4 & 0xfffffff0);
                  uVar45 = (byte)((char)pUVar12[uVar36] - 1) & 0xf;
                  *(char *)(pUVar12 + uVar36) = (char)uVar45;
                  *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar36 * 2) = (char)uVar40;
                  pUVar11[uVar36 + uVar45] = (uint)uVar39;
                  uVar39 = uVar39 + 1;
                } while (uVar39 < (uVar41 & 0xffffffff));
              }
              ms->nextToUpdate = uVar44;
              uVar40 = ms->hashCache[uVar44 & 7];
              ms->hashCache[uVar44 & 7] =
                   (U32)((ulong)(*(long *)(pBVar30 + (uVar41 & 0xffffffff) + 8) *
                                -0x30e4432340650000) >> (bVar25 & 0x3f));
              uVar41 = (ulong)(uVar40 >> 4 & 0xfffffff0);
              bVar25 = (byte)pUVar12[uVar41];
              pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
              uVar89 = (undefined1)(uVar40 >> 0x18);
              uVar87 = (undefined1)(uVar40 >> 0x10);
              uVar85 = (undefined1)(uVar40 >> 8);
              auVar77._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40))
                        >> 0x20);
              auVar77[3] = uVar85;
              auVar77[2] = uVar85;
              auVar77[0] = (undefined1)uVar40;
              auVar77[1] = auVar77[0];
              auVar77._8_8_ = 0;
              auVar92 = pshuflw(auVar77,auVar77,0);
              cVar58 = auVar92[0];
              auVar78[0] = -(cVar58 == *pcVar6);
              cVar86 = auVar92[1];
              auVar78[1] = -(cVar86 == pcVar6[1]);
              cVar88 = auVar92[2];
              auVar78[2] = -(cVar88 == pcVar6[2]);
              cVar90 = auVar92[3];
              auVar78[3] = -(cVar90 == pcVar6[3]);
              auVar78[4] = -(cVar58 == pcVar6[4]);
              auVar78[5] = -(cVar86 == pcVar6[5]);
              auVar78[6] = -(cVar88 == pcVar6[6]);
              auVar78[7] = -(cVar90 == pcVar6[7]);
              auVar78[8] = -(cVar58 == pcVar6[8]);
              auVar78[9] = -(cVar86 == pcVar6[9]);
              auVar78[10] = -(cVar88 == pcVar6[10]);
              auVar78[0xb] = -(cVar90 == pcVar6[0xb]);
              auVar78[0xc] = -(cVar58 == pcVar6[0xc]);
              auVar78[0xd] = -(cVar86 == pcVar6[0xd]);
              auVar78[0xe] = -(cVar88 == pcVar6[0xe]);
              auVar78[0xf] = -(cVar90 == pcVar6[0xf]);
              uVar13 = (ushort)(SUB161(auVar78 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar78 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar78 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar78 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar78 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar78 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar78 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar78 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar78 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar78 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar78 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar78 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar78 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar78 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar78 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar78[0xf] >> 7) << 0xf;
              uVar40 = (uint)uVar13;
              if ((bVar25 & 0xf) != 0) {
                uVar40 = (uint)uVar13 << (0x10 - (bVar25 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar13 >> (bVar25 & 0xf));
              }
              if (uVar40 == 0) {
                lVar37 = 0;
              }
              else {
                lVar46 = 0;
                while( true ) {
                  iVar43 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                    }
                  }
                  lVar37 = lVar46;
                  if (pUVar11[uVar41 + (iVar43 + (uint)bVar25 & 0xf)] < uVar27) break;
                  lVar37 = lVar46 + 1;
                  auStack_c8[lVar46] = pUVar11[uVar41 + (iVar43 + (uint)bVar25 & 0xf)];
                  uVar40 = uVar40 & uVar40 - 1;
                  if ((uVar40 == 0) ||
                     (iVar43 = (int)lVar46, lVar46 = lVar37,
                     (int)(1L << (bVar24 & 0x3f)) + -1 == iVar43)) break;
                }
              }
              uVar40 = bVar25 - 1 & 0xf;
              *(char *)(pUVar12 + uVar41) = (char)uVar40;
              *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar77[0];
              UVar35 = ms->nextToUpdate;
              ms->nextToUpdate = UVar35 + 1;
              pUVar11[uVar41 + uVar40] = UVar35;
              if (lVar37 == 0) goto LAB_006df808;
              local_1d0 = 999999999;
              uVar41 = 3;
              lVar46 = 0;
              do {
                uVar40 = auStack_c8[lVar46];
                uVar39 = (ulong)uVar40;
                if (uVar40 < uVar31) {
                  if (*(int *)(pBVar23 + uVar39) == *(int *)puVar42) {
                    sVar21 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar22 + 6),pBVar23 + uVar39 + 4,
                                        (BYTE *)iEnd,pBVar23 + uVar31,pBVar30 + uVar31);
                    uVar39 = sVar21 + 4;
LAB_006dee57:
                    if ((uVar41 < uVar39) &&
                       (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar39,
                       (ulong *)((long)puVar42 + uVar39) == iEnd)) break;
                  }
                }
                else {
                  puVar47 = (ulong *)(pBVar30 + uVar39);
                  if (*(BYTE *)(uVar41 + (long)puVar47) == *(BYTE *)((long)puVar42 + uVar41)) {
                    puVar48 = puVar42;
                    if (puVar42 < puVar1) {
                      if (*puVar47 == *puVar42) {
                        lVar29 = 0;
                        do {
                          puVar48 = (ulong *)((long)puVar22 + lVar29 + 10);
                          if (puVar1 <= puVar48) {
                            puVar47 = (ulong *)(pBVar30 + lVar29 + uVar39 + 8);
                            goto LAB_006dee11;
                          }
                          lVar15 = lVar29 + uVar39 + 8;
                          lVar29 = lVar29 + 8;
                        } while (*(ulong *)(pBVar30 + lVar15) == *puVar48);
                        uVar36 = *puVar48 ^ *(ulong *)(pBVar30 + lVar15);
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar29;
                      }
                      else {
                        uVar36 = *puVar42 ^ *puVar47;
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = uVar39 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_006dee11:
                      if ((puVar48 < puVar2) && ((int)*puVar47 == (int)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 4);
                        puVar47 = (ulong *)((long)puVar47 + 4);
                      }
                      if ((puVar48 < puVar3) && ((short)*puVar47 == (short)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 2);
                        puVar47 = (ulong *)((long)puVar47 + 2);
                      }
                      if (puVar48 < iEnd) {
                        puVar48 = (ulong *)((long)puVar48 +
                                           (ulong)((BYTE)*puVar47 == (BYTE)*puVar48));
                      }
                      uVar39 = (long)puVar48 - (long)puVar42;
                    }
                    goto LAB_006dee57;
                  }
                }
                lVar46 = lVar46 + 1;
              } while (lVar46 != lVar37);
            }
            else if (uVar27 == 5) {
              pUVar11 = ms->hashTable;
              pUVar12 = ms->tagTable;
              pBVar30 = (ms->window).base;
              uVar41 = (long)puVar42 - (long)pBVar30;
              uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar40 = (ms->window).lowLimit;
              uVar44 = (uint)uVar41;
              uVar27 = uVar44 - uVar31;
              if (uVar44 - uVar40 <= uVar31) {
                uVar27 = uVar40;
              }
              pBVar23 = (ms->window).dictBase;
              uVar31 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar27 = uVar40;
              }
              uVar39 = (ulong)ms->nextToUpdate;
              bVar25 = 0x38 - (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar44) {
                do {
                  uVar45 = (uint)uVar39 & 7;
                  uVar40 = ms->hashCache[uVar45];
                  ms->hashCache[uVar45] =
                       (U32)((ulong)(*(long *)(pBVar30 + uVar39 + 8) * -0x30e4432345000000) >>
                            (bVar25 & 0x3f));
                  uVar36 = (ulong)(uVar40 >> 4 & 0xfffffff0);
                  uVar45 = (byte)((char)pUVar12[uVar36] - 1) & 0xf;
                  *(char *)(pUVar12 + uVar36) = (char)uVar45;
                  *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar36 * 2) = (char)uVar40;
                  pUVar11[uVar36 + uVar45] = (uint)uVar39;
                  uVar39 = uVar39 + 1;
                } while (uVar39 < (uVar41 & 0xffffffff));
              }
              ms->nextToUpdate = uVar44;
              uVar40 = ms->hashCache[uVar44 & 7];
              ms->hashCache[uVar44 & 7] =
                   (U32)((ulong)(*(long *)(pBVar30 + (uVar41 & 0xffffffff) + 8) *
                                -0x30e4432345000000) >> (bVar25 & 0x3f));
              uVar41 = (ulong)(uVar40 >> 4 & 0xfffffff0);
              bVar25 = (byte)pUVar12[uVar41];
              pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
              uVar89 = (undefined1)(uVar40 >> 0x18);
              uVar87 = (undefined1)(uVar40 >> 0x10);
              uVar85 = (undefined1)(uVar40 >> 8);
              auVar80._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40))
                        >> 0x20);
              auVar80[3] = uVar85;
              auVar80[2] = uVar85;
              auVar80[0] = (undefined1)uVar40;
              auVar80[1] = auVar80[0];
              auVar80._8_8_ = 0;
              auVar92 = pshuflw(auVar80,auVar80,0);
              cVar58 = auVar92[0];
              auVar81[0] = -(cVar58 == *pcVar6);
              cVar86 = auVar92[1];
              auVar81[1] = -(cVar86 == pcVar6[1]);
              cVar88 = auVar92[2];
              auVar81[2] = -(cVar88 == pcVar6[2]);
              cVar90 = auVar92[3];
              auVar81[3] = -(cVar90 == pcVar6[3]);
              auVar81[4] = -(cVar58 == pcVar6[4]);
              auVar81[5] = -(cVar86 == pcVar6[5]);
              auVar81[6] = -(cVar88 == pcVar6[6]);
              auVar81[7] = -(cVar90 == pcVar6[7]);
              auVar81[8] = -(cVar58 == pcVar6[8]);
              auVar81[9] = -(cVar86 == pcVar6[9]);
              auVar81[10] = -(cVar88 == pcVar6[10]);
              auVar81[0xb] = -(cVar90 == pcVar6[0xb]);
              auVar81[0xc] = -(cVar58 == pcVar6[0xc]);
              auVar81[0xd] = -(cVar86 == pcVar6[0xd]);
              auVar81[0xe] = -(cVar88 == pcVar6[0xe]);
              auVar81[0xf] = -(cVar90 == pcVar6[0xf]);
              uVar13 = (ushort)(SUB161(auVar81 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar81[0xf] >> 7) << 0xf;
              uVar40 = (uint)uVar13;
              if ((bVar25 & 0xf) != 0) {
                uVar40 = (uint)uVar13 << (0x10 - (bVar25 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar13 >> (bVar25 & 0xf));
              }
              if (uVar40 == 0) {
                lVar37 = 0;
              }
              else {
                lVar46 = 0;
                while( true ) {
                  iVar43 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                    }
                  }
                  lVar37 = lVar46;
                  if (pUVar11[uVar41 + (iVar43 + (uint)bVar25 & 0xf)] < uVar27) break;
                  lVar37 = lVar46 + 1;
                  auStack_c8[lVar46] = pUVar11[uVar41 + (iVar43 + (uint)bVar25 & 0xf)];
                  uVar40 = uVar40 & uVar40 - 1;
                  if ((uVar40 == 0) ||
                     (iVar43 = (int)lVar46, lVar46 = lVar37, (1 << (bVar24 & 0x1f)) + -1 == iVar43))
                  break;
                }
              }
              uVar40 = bVar25 - 1 & 0xf;
              *(char *)(pUVar12 + uVar41) = (char)uVar40;
              *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar80[0];
              UVar35 = ms->nextToUpdate;
              ms->nextToUpdate = UVar35 + 1;
              pUVar11[uVar41 + uVar40] = UVar35;
              if (lVar37 == 0) goto LAB_006df808;
              local_1d0 = 999999999;
              uVar41 = 3;
              lVar46 = 0;
              do {
                uVar40 = auStack_c8[lVar46];
                uVar39 = (ulong)uVar40;
                if (uVar40 < uVar31) {
                  if (*(int *)(pBVar23 + uVar39) == *(int *)puVar42) {
                    sVar21 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar22 + 6),pBVar23 + uVar39 + 4,
                                        (BYTE *)iEnd,pBVar23 + uVar31,pBVar30 + uVar31);
                    uVar39 = sVar21 + 4;
LAB_006df438:
                    if ((uVar41 < uVar39) &&
                       (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar39,
                       (ulong *)((long)puVar42 + uVar39) == iEnd)) break;
                  }
                }
                else {
                  puVar47 = (ulong *)(pBVar30 + uVar39);
                  if (*(BYTE *)(uVar41 + (long)puVar47) == *(BYTE *)((long)puVar42 + uVar41)) {
                    puVar48 = puVar42;
                    if (puVar42 < puVar1) {
                      if (*puVar47 == *puVar42) {
                        lVar29 = 0;
                        do {
                          puVar48 = (ulong *)((long)puVar22 + lVar29 + 10);
                          if (puVar1 <= puVar48) {
                            puVar47 = (ulong *)(pBVar30 + lVar29 + uVar39 + 8);
                            goto LAB_006df3f2;
                          }
                          lVar15 = lVar29 + uVar39 + 8;
                          lVar29 = lVar29 + 8;
                        } while (*(ulong *)(pBVar30 + lVar15) == *puVar48);
                        uVar36 = *puVar48 ^ *(ulong *)(pBVar30 + lVar15);
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar29;
                      }
                      else {
                        uVar36 = *puVar42 ^ *puVar47;
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = uVar39 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_006df3f2:
                      if ((puVar48 < puVar2) && ((int)*puVar47 == (int)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 4);
                        puVar47 = (ulong *)((long)puVar47 + 4);
                      }
                      if ((puVar48 < puVar3) && ((short)*puVar47 == (short)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 2);
                        puVar47 = (ulong *)((long)puVar47 + 2);
                      }
                      if (puVar48 < iEnd) {
                        puVar48 = (ulong *)((long)puVar48 +
                                           (ulong)((BYTE)*puVar47 == (BYTE)*puVar48));
                      }
                      uVar39 = (long)puVar48 - (long)puVar42;
                    }
                    goto LAB_006df438;
                  }
                }
                lVar46 = lVar46 + 1;
              } while (lVar46 != lVar37);
            }
            else {
              pUVar11 = ms->hashTable;
              pUVar12 = ms->tagTable;
              pBVar30 = (ms->window).base;
              uVar41 = (long)puVar42 - (long)pBVar30;
              uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar40 = (ms->window).lowLimit;
              uVar44 = (uint)uVar41;
              uVar27 = uVar44 - uVar31;
              if (uVar44 - uVar40 <= uVar31) {
                uVar27 = uVar40;
              }
              pBVar23 = (ms->window).dictBase;
              uVar31 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar27 = uVar40;
              }
              uVar39 = (ulong)ms->nextToUpdate;
              bVar25 = 0x18 - (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar44) {
                do {
                  uVar45 = (uint)uVar39 & 7;
                  uVar40 = ms->hashCache[uVar45];
                  ms->hashCache[uVar45] =
                       (uint)(*(int *)(pBVar30 + uVar39 + 8) * -0x61c8864f) >> (bVar25 & 0x1f);
                  uVar36 = (ulong)(uVar40 >> 4 & 0xfffffff0);
                  uVar45 = (byte)((char)pUVar12[uVar36] - 1) & 0xf;
                  *(char *)(pUVar12 + uVar36) = (char)uVar45;
                  *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar36 * 2) = (char)uVar40;
                  pUVar11[uVar36 + uVar45] = (uint)uVar39;
                  uVar39 = uVar39 + 1;
                } while (uVar39 < (uVar41 & 0xffffffff));
              }
              ms->nextToUpdate = uVar44;
              uVar40 = ms->hashCache[uVar44 & 7];
              ms->hashCache[uVar44 & 7] =
                   (uint)(*(int *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x61c8864f) >>
                   (bVar25 & 0x1f);
              uVar41 = (ulong)(uVar40 >> 4 & 0xfffffff0);
              bVar25 = (byte)pUVar12[uVar41];
              pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
              uVar89 = (undefined1)(uVar40 >> 0x18);
              uVar87 = (undefined1)(uVar40 >> 0x10);
              uVar85 = (undefined1)(uVar40 >> 8);
              auVar83._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40))
                        >> 0x20);
              auVar83[3] = uVar85;
              auVar83[2] = uVar85;
              auVar83[0] = (undefined1)uVar40;
              auVar83[1] = auVar83[0];
              auVar83._8_8_ = 0;
              auVar92 = pshuflw(auVar83,auVar83,0);
              cVar58 = auVar92[0];
              auVar84[0] = -(cVar58 == *pcVar6);
              cVar86 = auVar92[1];
              auVar84[1] = -(cVar86 == pcVar6[1]);
              cVar88 = auVar92[2];
              auVar84[2] = -(cVar88 == pcVar6[2]);
              cVar90 = auVar92[3];
              auVar84[3] = -(cVar90 == pcVar6[3]);
              auVar84[4] = -(cVar58 == pcVar6[4]);
              auVar84[5] = -(cVar86 == pcVar6[5]);
              auVar84[6] = -(cVar88 == pcVar6[6]);
              auVar84[7] = -(cVar90 == pcVar6[7]);
              auVar84[8] = -(cVar58 == pcVar6[8]);
              auVar84[9] = -(cVar86 == pcVar6[9]);
              auVar84[10] = -(cVar88 == pcVar6[10]);
              auVar84[0xb] = -(cVar90 == pcVar6[0xb]);
              auVar84[0xc] = -(cVar58 == pcVar6[0xc]);
              auVar84[0xd] = -(cVar86 == pcVar6[0xd]);
              auVar84[0xe] = -(cVar88 == pcVar6[0xe]);
              auVar84[0xf] = -(cVar90 == pcVar6[0xf]);
              uVar13 = (ushort)(SUB161(auVar84 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar84 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar84 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar84 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar84 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar84 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar84 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar84 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar84 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar84 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar84 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar84 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar84 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar84 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar84 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar84[0xf] >> 7) << 0xf;
              uVar40 = (uint)uVar13;
              if ((bVar25 & 0xf) != 0) {
                uVar40 = (uint)uVar13 << (0x10 - (bVar25 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar13 >> (bVar25 & 0xf));
              }
              if (uVar40 == 0) {
                lVar37 = 0;
              }
              else {
                lVar46 = 0;
                while( true ) {
                  iVar43 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                    }
                  }
                  lVar37 = lVar46;
                  if (pUVar11[uVar41 + (iVar43 + (uint)bVar25 & 0xf)] < uVar27) break;
                  lVar37 = lVar46 + 1;
                  auStack_c8[lVar46] = pUVar11[uVar41 + (iVar43 + (uint)bVar25 & 0xf)];
                  uVar40 = uVar40 & uVar40 - 1;
                  if ((uVar40 == 0) ||
                     (iVar43 = (int)lVar46, lVar46 = lVar37,
                     (int)(1L << (bVar24 & 0x3f)) + -1 == iVar43)) break;
                }
              }
              uVar40 = bVar25 - 1 & 0xf;
              *(char *)(pUVar12 + uVar41) = (char)uVar40;
              *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar83[0];
              UVar35 = ms->nextToUpdate;
              ms->nextToUpdate = UVar35 + 1;
              pUVar11[uVar41 + uVar40] = UVar35;
              if (lVar37 == 0) goto LAB_006df808;
              local_1d0 = 999999999;
              uVar41 = 3;
              lVar46 = 0;
              do {
                uVar40 = auStack_c8[lVar46];
                uVar39 = (ulong)uVar40;
                if (uVar40 < uVar31) {
                  if (*(int *)(pBVar23 + uVar39) == *(int *)puVar42) {
                    sVar21 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar22 + 6),pBVar23 + uVar39 + 4,
                                        (BYTE *)iEnd,pBVar23 + uVar31,pBVar30 + uVar31);
                    uVar39 = sVar21 + 4;
LAB_006df7da:
                    if ((uVar41 < uVar39) &&
                       (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar39,
                       (ulong *)((long)puVar42 + uVar39) == iEnd)) break;
                  }
                }
                else {
                  puVar47 = (ulong *)(pBVar30 + uVar39);
                  if (*(BYTE *)(uVar41 + (long)puVar47) == *(BYTE *)((long)puVar42 + uVar41)) {
                    puVar48 = puVar42;
                    if (puVar42 < puVar1) {
                      if (*puVar47 == *puVar42) {
                        lVar29 = 0;
                        do {
                          puVar48 = (ulong *)((long)puVar22 + lVar29 + 10);
                          if (puVar1 <= puVar48) {
                            puVar47 = (ulong *)(pBVar30 + lVar29 + uVar39 + 8);
                            goto LAB_006df794;
                          }
                          lVar15 = lVar29 + uVar39 + 8;
                          lVar29 = lVar29 + 8;
                        } while (*(ulong *)(pBVar30 + lVar15) == *puVar48);
                        uVar36 = *puVar48 ^ *(ulong *)(pBVar30 + lVar15);
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar29;
                      }
                      else {
                        uVar36 = *puVar42 ^ *puVar47;
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = uVar39 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_006df794:
                      if ((puVar48 < puVar2) && ((int)*puVar47 == (int)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 4);
                        puVar47 = (ulong *)((long)puVar47 + 4);
                      }
                      if ((puVar48 < puVar3) && ((short)*puVar47 == (short)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 2);
                        puVar47 = (ulong *)((long)puVar47 + 2);
                      }
                      if (puVar48 < iEnd) {
                        puVar48 = (ulong *)((long)puVar48 +
                                           (ulong)((BYTE)*puVar47 == (BYTE)*puVar48));
                      }
                      uVar39 = (long)puVar48 - (long)puVar42;
                    }
                    goto LAB_006df7da;
                  }
                }
                lVar46 = lVar46 + 1;
              } while (lVar46 != lVar37);
            }
          }
          else if (uVar27 - 6 < 2) {
            pUVar11 = ms->hashTable;
            pBVar30 = (ms->window).base;
            uVar41 = (long)puVar42 - (long)pBVar30;
            uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar40 = (ms->window).lowLimit;
            uVar44 = (uint)uVar41;
            uVar27 = uVar44 - uVar31;
            if (uVar44 - uVar40 <= uVar31) {
              uVar27 = uVar40;
            }
            pUVar12 = ms->tagTable;
            pBVar23 = (ms->window).dictBase;
            uVar31 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar27 = uVar40;
            }
            uVar39 = (ulong)ms->nextToUpdate;
            bVar24 = 0x38 - (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar44) {
              do {
                uVar45 = (uint)uVar39 & 7;
                uVar40 = ms->hashCache[uVar45];
                ms->hashCache[uVar45] =
                     (U32)((ulong)(*(long *)(pBVar30 + uVar39 + 8) * -0x30e4432340650000) >>
                          (bVar24 & 0x3f));
                uVar36 = (ulong)(uVar40 >> 3 & 0xffffffe0);
                uVar45 = (byte)((char)pUVar12[uVar36] - 1) & 0x1f;
                *(char *)(pUVar12 + uVar36) = (char)uVar45;
                *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar36 * 2) = (char)uVar40;
                pUVar11[uVar36 + uVar45] = (uint)uVar39;
                uVar39 = uVar39 + 1;
              } while (uVar39 < (uVar41 & 0xffffffff));
            }
            ms->nextToUpdate = uVar44;
            uVar40 = ms->hashCache[uVar44 & 7];
            ms->hashCache[uVar44 & 7] =
                 (U32)((ulong)(*(long *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x30e4432340650000)
                      >> (bVar24 & 0x3f));
            uVar41 = (ulong)(uVar40 >> 3 & 0xffffffe0);
            bVar24 = (byte)pUVar12[uVar41];
            pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
            pcVar7 = (char *)((long)pUVar12 + uVar41 * 2 + 0x11);
            uVar89 = (undefined1)(uVar40 >> 0x18);
            uVar87 = (undefined1)(uVar40 >> 0x10);
            uVar85 = (undefined1)(uVar40 >> 8);
            auVar98._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40)) >>
                      0x20);
            auVar98[3] = uVar85;
            auVar98[2] = uVar85;
            auVar98[0] = (undefined1)uVar40;
            auVar98[1] = auVar98[0];
            auVar98._8_8_ = 0;
            auVar92 = pshuflw(auVar98,auVar98,0);
            cVar58 = auVar92[0];
            auVar55[0] = -(*pcVar6 == cVar58);
            cVar86 = auVar92[1];
            auVar55[1] = -(pcVar6[1] == cVar86);
            cVar88 = auVar92[2];
            auVar55[2] = -(pcVar6[2] == cVar88);
            cVar90 = auVar92[3];
            auVar55[3] = -(pcVar6[3] == cVar90);
            auVar55[4] = -(pcVar6[4] == cVar58);
            auVar55[5] = -(pcVar6[5] == cVar86);
            auVar55[6] = -(pcVar6[6] == cVar88);
            auVar55[7] = -(pcVar6[7] == cVar90);
            auVar55[8] = -(pcVar6[8] == cVar58);
            auVar55[9] = -(pcVar6[9] == cVar86);
            auVar55[10] = -(pcVar6[10] == cVar88);
            auVar55[0xb] = -(pcVar6[0xb] == cVar90);
            auVar55[0xc] = -(pcVar6[0xc] == cVar58);
            auVar55[0xd] = -(pcVar6[0xd] == cVar86);
            auVar55[0xe] = -(pcVar6[0xe] == cVar88);
            auVar55[0xf] = -(pcVar6[0xf] == cVar90);
            auVar76[0] = -(*pcVar7 == cVar58);
            auVar76[1] = -(pcVar7[1] == cVar86);
            auVar76[2] = -(pcVar7[2] == cVar88);
            auVar76[3] = -(pcVar7[3] == cVar90);
            auVar76[4] = -(pcVar7[4] == cVar58);
            auVar76[5] = -(pcVar7[5] == cVar86);
            auVar76[6] = -(pcVar7[6] == cVar88);
            auVar76[7] = -(pcVar7[7] == cVar90);
            auVar76[8] = -(pcVar7[8] == cVar58);
            auVar76[9] = -(pcVar7[9] == cVar86);
            auVar76[10] = -(pcVar7[10] == cVar88);
            auVar76[0xb] = -(pcVar7[0xb] == cVar90);
            auVar76[0xc] = -(pcVar7[0xc] == cVar58);
            auVar76[0xd] = -(pcVar7[0xd] == cVar86);
            auVar76[0xe] = -(pcVar7[0xe] == cVar88);
            auVar76[0xf] = -(pcVar7[0xf] == cVar90);
            uVar45 = CONCAT22((ushort)(SUB161(auVar76 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar76 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar76 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar76 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar76 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar76 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar76 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar76 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar76 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar76 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar76 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar76 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar76 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar76[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar55 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar55[0xf] >> 7) << 0xf);
            uVar40 = uVar45 >> (bVar24 & 0x1f) | uVar45 << 0x20 - (bVar24 & 0x1f);
            if ((bVar24 & 0x1f) == 0) {
              uVar40 = uVar45;
            }
            if (uVar40 == 0) {
              lVar37 = 0;
            }
            else {
              lVar46 = 0;
              while( true ) {
                iVar43 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                  }
                }
                lVar37 = lVar46;
                if (pUVar11[uVar41 + (iVar43 + (uint)bVar24 & 0x1f)] < uVar27) break;
                lVar37 = lVar46 + 1;
                auStack_c8[lVar46] = pUVar11[uVar41 + (iVar43 + (uint)bVar24 & 0x1f)];
                uVar40 = uVar40 & uVar40 - 1;
                if ((uVar40 == 0) || (iVar43 = (int)lVar46, lVar46 = lVar37, iVar43 == 0x1f)) break;
              }
            }
            uVar40 = bVar24 - 1 & 0x1f;
            *(char *)(pUVar12 + uVar41) = (char)uVar40;
            *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar98[0];
            UVar35 = ms->nextToUpdate;
            ms->nextToUpdate = UVar35 + 1;
            pUVar11[uVar41 + uVar40] = UVar35;
            if (lVar37 == 0) goto LAB_006df808;
            local_1d0 = 999999999;
            uVar41 = 3;
            lVar46 = 0;
            do {
              uVar40 = auStack_c8[lVar46];
              uVar39 = (ulong)uVar40;
              if (uVar40 < uVar31) {
                if (*(int *)(pBVar23 + uVar39) == *(int *)puVar42) {
                  sVar21 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar22 + 6),pBVar23 + uVar39 + 4,(BYTE *)iEnd,
                                      pBVar23 + uVar31,pBVar30 + uVar31);
                  uVar39 = sVar21 + 4;
LAB_006dec84:
                  if ((uVar41 < uVar39) &&
                     (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar39,
                     (ulong *)((long)puVar42 + uVar39) == iEnd)) break;
                }
              }
              else {
                puVar47 = (ulong *)(pBVar30 + uVar39);
                if (*(BYTE *)(uVar41 + (long)puVar47) == *(BYTE *)((long)puVar42 + uVar41)) {
                  puVar48 = puVar42;
                  if (puVar42 < puVar1) {
                    if (*puVar47 == *puVar42) {
                      lVar29 = 0;
                      do {
                        puVar48 = (ulong *)((long)puVar22 + lVar29 + 10);
                        if (puVar1 <= puVar48) {
                          puVar47 = (ulong *)(pBVar30 + lVar29 + uVar39 + 8);
                          goto LAB_006dec3e;
                        }
                        lVar15 = lVar29 + uVar39 + 8;
                        lVar29 = lVar29 + 8;
                      } while (*(ulong *)(pBVar30 + lVar15) == *puVar48);
                      uVar36 = *puVar48 ^ *(ulong *)(pBVar30 + lVar15);
                      uVar39 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar29;
                    }
                    else {
                      uVar36 = *puVar42 ^ *puVar47;
                      uVar39 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      uVar39 = uVar39 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_006dec3e:
                    if ((puVar48 < puVar2) && ((int)*puVar47 == (int)*puVar48)) {
                      puVar48 = (ulong *)((long)puVar48 + 4);
                      puVar47 = (ulong *)((long)puVar47 + 4);
                    }
                    if ((puVar48 < puVar3) && ((short)*puVar47 == (short)*puVar48)) {
                      puVar48 = (ulong *)((long)puVar48 + 2);
                      puVar47 = (ulong *)((long)puVar47 + 2);
                    }
                    if (puVar48 < iEnd) {
                      puVar48 = (ulong *)((long)puVar48 + (ulong)((BYTE)*puVar47 == (BYTE)*puVar48))
                      ;
                    }
                    uVar39 = (long)puVar48 - (long)puVar42;
                  }
                  goto LAB_006dec84;
                }
              }
              lVar46 = lVar46 + 1;
            } while (lVar46 != lVar37);
          }
          else if (uVar27 == 5) {
            pUVar11 = ms->hashTable;
            pBVar30 = (ms->window).base;
            uVar41 = (long)puVar42 - (long)pBVar30;
            uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar40 = (ms->window).lowLimit;
            uVar44 = (uint)uVar41;
            uVar27 = uVar44 - uVar31;
            if (uVar44 - uVar40 <= uVar31) {
              uVar27 = uVar40;
            }
            pUVar12 = ms->tagTable;
            pBVar23 = (ms->window).dictBase;
            uVar31 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar27 = uVar40;
            }
            uVar39 = (ulong)ms->nextToUpdate;
            bVar24 = 0x38 - (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar44) {
              do {
                uVar45 = (uint)uVar39 & 7;
                uVar40 = ms->hashCache[uVar45];
                ms->hashCache[uVar45] =
                     (U32)((ulong)(*(long *)(pBVar30 + uVar39 + 8) * -0x30e4432345000000) >>
                          (bVar24 & 0x3f));
                uVar36 = (ulong)(uVar40 >> 3 & 0xffffffe0);
                uVar45 = (byte)((char)pUVar12[uVar36] - 1) & 0x1f;
                *(char *)(pUVar12 + uVar36) = (char)uVar45;
                *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar36 * 2) = (char)uVar40;
                pUVar11[uVar36 + uVar45] = (uint)uVar39;
                uVar39 = uVar39 + 1;
              } while (uVar39 < (uVar41 & 0xffffffff));
            }
            ms->nextToUpdate = uVar44;
            uVar40 = ms->hashCache[uVar44 & 7];
            ms->hashCache[uVar44 & 7] =
                 (U32)((ulong)(*(long *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x30e4432345000000)
                      >> (bVar24 & 0x3f));
            uVar41 = (ulong)(uVar40 >> 3 & 0xffffffe0);
            bVar24 = (byte)pUVar12[uVar41];
            pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
            pcVar7 = (char *)((long)pUVar12 + uVar41 * 2 + 0x11);
            uVar89 = (undefined1)(uVar40 >> 0x18);
            uVar87 = (undefined1)(uVar40 >> 0x10);
            uVar85 = (undefined1)(uVar40 >> 8);
            auVar99._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40)) >>
                      0x20);
            auVar99[3] = uVar85;
            auVar99[2] = uVar85;
            auVar99[0] = (undefined1)uVar40;
            auVar99[1] = auVar99[0];
            auVar99._8_8_ = 0;
            auVar92 = pshuflw(auVar99,auVar99,0);
            cVar58 = auVar92[0];
            auVar56[0] = -(*pcVar6 == cVar58);
            cVar86 = auVar92[1];
            auVar56[1] = -(pcVar6[1] == cVar86);
            cVar88 = auVar92[2];
            auVar56[2] = -(pcVar6[2] == cVar88);
            cVar90 = auVar92[3];
            auVar56[3] = -(pcVar6[3] == cVar90);
            auVar56[4] = -(pcVar6[4] == cVar58);
            auVar56[5] = -(pcVar6[5] == cVar86);
            auVar56[6] = -(pcVar6[6] == cVar88);
            auVar56[7] = -(pcVar6[7] == cVar90);
            auVar56[8] = -(pcVar6[8] == cVar58);
            auVar56[9] = -(pcVar6[9] == cVar86);
            auVar56[10] = -(pcVar6[10] == cVar88);
            auVar56[0xb] = -(pcVar6[0xb] == cVar90);
            auVar56[0xc] = -(pcVar6[0xc] == cVar58);
            auVar56[0xd] = -(pcVar6[0xd] == cVar86);
            auVar56[0xe] = -(pcVar6[0xe] == cVar88);
            auVar56[0xf] = -(pcVar6[0xf] == cVar90);
            auVar79[0] = -(*pcVar7 == cVar58);
            auVar79[1] = -(pcVar7[1] == cVar86);
            auVar79[2] = -(pcVar7[2] == cVar88);
            auVar79[3] = -(pcVar7[3] == cVar90);
            auVar79[4] = -(pcVar7[4] == cVar58);
            auVar79[5] = -(pcVar7[5] == cVar86);
            auVar79[6] = -(pcVar7[6] == cVar88);
            auVar79[7] = -(pcVar7[7] == cVar90);
            auVar79[8] = -(pcVar7[8] == cVar58);
            auVar79[9] = -(pcVar7[9] == cVar86);
            auVar79[10] = -(pcVar7[10] == cVar88);
            auVar79[0xb] = -(pcVar7[0xb] == cVar90);
            auVar79[0xc] = -(pcVar7[0xc] == cVar58);
            auVar79[0xd] = -(pcVar7[0xd] == cVar86);
            auVar79[0xe] = -(pcVar7[0xe] == cVar88);
            auVar79[0xf] = -(pcVar7[0xf] == cVar90);
            uVar45 = CONCAT22((ushort)(SUB161(auVar79 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar79 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar79[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar56 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar56 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar56[0xf] >> 7) << 0xf);
            uVar40 = uVar45 >> (bVar24 & 0x1f) | uVar45 << 0x20 - (bVar24 & 0x1f);
            if ((bVar24 & 0x1f) == 0) {
              uVar40 = uVar45;
            }
            if (uVar40 == 0) {
              lVar37 = 0;
            }
            else {
              lVar46 = 0;
              while( true ) {
                iVar43 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                  }
                }
                lVar37 = lVar46;
                if (pUVar11[uVar41 + (iVar43 + (uint)bVar24 & 0x1f)] < uVar27) break;
                lVar37 = lVar46 + 1;
                auStack_c8[lVar46] = pUVar11[uVar41 + (iVar43 + (uint)bVar24 & 0x1f)];
                uVar40 = uVar40 & uVar40 - 1;
                if ((uVar40 == 0) || (iVar43 = (int)lVar46, lVar46 = lVar37, iVar43 == 0x1f)) break;
              }
            }
            uVar40 = bVar24 - 1 & 0x1f;
            *(char *)(pUVar12 + uVar41) = (char)uVar40;
            *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar99[0];
            UVar35 = ms->nextToUpdate;
            ms->nextToUpdate = UVar35 + 1;
            pUVar11[uVar41 + uVar40] = UVar35;
            if (lVar37 == 0) {
LAB_006df808:
              local_1d0 = 999999999;
              uVar41 = 3;
            }
            else {
              local_1d0 = 999999999;
              uVar41 = 3;
              lVar46 = 0;
              do {
                uVar40 = auStack_c8[lVar46];
                uVar39 = (ulong)uVar40;
                if (uVar40 < uVar31) {
                  if (*(int *)(pBVar23 + uVar39) == *(int *)puVar42) {
                    sVar21 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar22 + 6),pBVar23 + uVar39 + 4,
                                        (BYTE *)iEnd,pBVar23 + uVar31,pBVar30 + uVar31);
                    uVar39 = sVar21 + 4;
LAB_006df265:
                    if ((uVar41 < uVar39) &&
                       (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar39,
                       (ulong *)((long)puVar42 + uVar39) == iEnd)) break;
                  }
                }
                else {
                  puVar47 = (ulong *)(pBVar30 + uVar39);
                  if (*(BYTE *)(uVar41 + (long)puVar47) == *(BYTE *)((long)puVar42 + uVar41)) {
                    puVar48 = puVar42;
                    if (puVar42 < puVar1) {
                      if (*puVar47 == *puVar42) {
                        lVar29 = 0;
                        do {
                          puVar48 = (ulong *)((long)puVar22 + lVar29 + 10);
                          if (puVar1 <= puVar48) {
                            puVar47 = (ulong *)(pBVar30 + lVar29 + uVar39 + 8);
                            goto LAB_006df21f;
                          }
                          lVar15 = lVar29 + uVar39 + 8;
                          lVar29 = lVar29 + 8;
                        } while (*(ulong *)(pBVar30 + lVar15) == *puVar48);
                        uVar36 = *puVar48 ^ *(ulong *)(pBVar30 + lVar15);
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar29;
                      }
                      else {
                        uVar36 = *puVar42 ^ *puVar47;
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        uVar39 = uVar39 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_006df21f:
                      if ((puVar48 < puVar2) && ((int)*puVar47 == (int)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 4);
                        puVar47 = (ulong *)((long)puVar47 + 4);
                      }
                      if ((puVar48 < puVar3) && ((short)*puVar47 == (short)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 2);
                        puVar47 = (ulong *)((long)puVar47 + 2);
                      }
                      if (puVar48 < iEnd) {
                        puVar48 = (ulong *)((long)puVar48 +
                                           (ulong)((BYTE)*puVar47 == (BYTE)*puVar48));
                      }
                      uVar39 = (long)puVar48 - (long)puVar42;
                    }
                    goto LAB_006df265;
                  }
                }
                lVar46 = lVar46 + 1;
              } while (lVar46 != lVar37);
            }
          }
          else {
            pUVar11 = ms->hashTable;
            pBVar30 = (ms->window).base;
            uVar41 = (long)puVar42 - (long)pBVar30;
            uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar40 = (ms->window).lowLimit;
            uVar44 = (uint)uVar41;
            uVar27 = uVar44 - uVar31;
            if (uVar44 - uVar40 <= uVar31) {
              uVar27 = uVar40;
            }
            pUVar12 = ms->tagTable;
            pBVar23 = (ms->window).dictBase;
            uVar31 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar27 = uVar40;
            }
            uVar39 = (ulong)ms->nextToUpdate;
            bVar24 = 0x18 - (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar44) {
              do {
                uVar45 = (uint)uVar39 & 7;
                uVar40 = ms->hashCache[uVar45];
                ms->hashCache[uVar45] =
                     (uint)(*(int *)(pBVar30 + uVar39 + 8) * -0x61c8864f) >> (bVar24 & 0x1f);
                uVar36 = (ulong)(uVar40 >> 3 & 0xffffffe0);
                uVar45 = (byte)((char)pUVar12[uVar36] - 1) & 0x1f;
                *(char *)(pUVar12 + uVar36) = (char)uVar45;
                *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar36 * 2) = (char)uVar40;
                pUVar11[uVar36 + uVar45] = (uint)uVar39;
                uVar39 = uVar39 + 1;
              } while (uVar39 < (uVar41 & 0xffffffff));
            }
            ms->nextToUpdate = uVar44;
            uVar40 = ms->hashCache[uVar44 & 7];
            ms->hashCache[uVar44 & 7] =
                 (uint)(*(int *)(pBVar30 + (uVar41 & 0xffffffff) + 8) * -0x61c8864f) >>
                 (bVar24 & 0x1f);
            uVar41 = (ulong)(uVar40 >> 3 & 0xffffffe0);
            bVar24 = (byte)pUVar12[uVar41];
            pcVar6 = (char *)((long)pUVar12 + uVar41 * 2 + 1);
            pcVar7 = (char *)((long)pUVar12 + uVar41 * 2 + 0x11);
            uVar89 = (undefined1)(uVar40 >> 0x18);
            uVar87 = (undefined1)(uVar40 >> 0x10);
            uVar85 = (undefined1)(uVar40 >> 8);
            auVar100._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar89,uVar89),uVar87),CONCAT14(uVar87,uVar40)) >>
                      0x20);
            auVar100[3] = uVar85;
            auVar100[2] = uVar85;
            auVar100[0] = (undefined1)uVar40;
            auVar100[1] = auVar100[0];
            auVar100._8_8_ = 0;
            auVar92 = pshuflw(auVar100,auVar100,0);
            cVar58 = auVar92[0];
            auVar57[0] = -(*pcVar6 == cVar58);
            cVar86 = auVar92[1];
            auVar57[1] = -(pcVar6[1] == cVar86);
            cVar88 = auVar92[2];
            auVar57[2] = -(pcVar6[2] == cVar88);
            cVar90 = auVar92[3];
            auVar57[3] = -(pcVar6[3] == cVar90);
            auVar57[4] = -(pcVar6[4] == cVar58);
            auVar57[5] = -(pcVar6[5] == cVar86);
            auVar57[6] = -(pcVar6[6] == cVar88);
            auVar57[7] = -(pcVar6[7] == cVar90);
            auVar57[8] = -(pcVar6[8] == cVar58);
            auVar57[9] = -(pcVar6[9] == cVar86);
            auVar57[10] = -(pcVar6[10] == cVar88);
            auVar57[0xb] = -(pcVar6[0xb] == cVar90);
            auVar57[0xc] = -(pcVar6[0xc] == cVar58);
            auVar57[0xd] = -(pcVar6[0xd] == cVar86);
            auVar57[0xe] = -(pcVar6[0xe] == cVar88);
            auVar57[0xf] = -(pcVar6[0xf] == cVar90);
            auVar82[0] = -(*pcVar7 == cVar58);
            auVar82[1] = -(pcVar7[1] == cVar86);
            auVar82[2] = -(pcVar7[2] == cVar88);
            auVar82[3] = -(pcVar7[3] == cVar90);
            auVar82[4] = -(pcVar7[4] == cVar58);
            auVar82[5] = -(pcVar7[5] == cVar86);
            auVar82[6] = -(pcVar7[6] == cVar88);
            auVar82[7] = -(pcVar7[7] == cVar90);
            auVar82[8] = -(pcVar7[8] == cVar58);
            auVar82[9] = -(pcVar7[9] == cVar86);
            auVar82[10] = -(pcVar7[10] == cVar88);
            auVar82[0xb] = -(pcVar7[0xb] == cVar90);
            auVar82[0xc] = -(pcVar7[0xc] == cVar58);
            auVar82[0xd] = -(pcVar7[0xd] == cVar86);
            auVar82[0xe] = -(pcVar7[0xe] == cVar88);
            auVar82[0xf] = -(pcVar7[0xf] == cVar90);
            uVar45 = CONCAT22((ushort)(SUB161(auVar82 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar82 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar82 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar82 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar82 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar82 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar82 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar82 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar82 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar82 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar82 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar82 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar82[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar57 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar57[0xf] >> 7) << 0xf);
            uVar40 = uVar45 >> (bVar24 & 0x1f) | uVar45 << 0x20 - (bVar24 & 0x1f);
            if ((bVar24 & 0x1f) == 0) {
              uVar40 = uVar45;
            }
            if (uVar40 == 0) {
              lVar37 = 0;
            }
            else {
              lVar46 = 0;
              while( true ) {
                iVar43 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                  }
                }
                lVar37 = lVar46;
                if (pUVar11[uVar41 + (iVar43 + (uint)bVar24 & 0x1f)] < uVar27) break;
                lVar37 = lVar46 + 1;
                auStack_c8[lVar46] = pUVar11[uVar41 + (iVar43 + (uint)bVar24 & 0x1f)];
                uVar40 = uVar40 & uVar40 - 1;
                if ((uVar40 == 0) || (iVar43 = (int)lVar46, lVar46 = lVar37, iVar43 == 0x1f)) break;
              }
            }
            uVar40 = bVar24 - 1 & 0x1f;
            *(char *)(pUVar12 + uVar41) = (char)uVar40;
            *(undefined1 *)((long)(pUVar12 + uVar41) + (ulong)uVar40 + 1) = auVar100[0];
            UVar35 = ms->nextToUpdate;
            ms->nextToUpdate = UVar35 + 1;
            pUVar11[uVar41 + uVar40] = UVar35;
            if (lVar37 == 0) goto LAB_006df808;
            local_1d0 = 999999999;
            uVar41 = 3;
            lVar46 = 0;
            do {
              uVar40 = auStack_c8[lVar46];
              uVar39 = (ulong)uVar40;
              if (uVar40 < uVar31) {
                if (*(int *)(pBVar23 + uVar39) == *(int *)puVar42) {
                  sVar21 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar22 + 6),pBVar23 + uVar39 + 4,(BYTE *)iEnd,
                                      pBVar23 + uVar31,pBVar30 + uVar31);
                  uVar39 = sVar21 + 4;
LAB_006df607:
                  if ((uVar41 < uVar39) &&
                     (local_1d0 = (ulong)((uVar44 + 2) - uVar40), uVar41 = uVar39,
                     (ulong *)((long)puVar42 + uVar39) == iEnd)) break;
                }
              }
              else {
                puVar47 = (ulong *)(pBVar30 + uVar39);
                if (*(BYTE *)(uVar41 + (long)puVar47) == *(BYTE *)((long)puVar42 + uVar41)) {
                  puVar48 = puVar42;
                  if (puVar42 < puVar1) {
                    if (*puVar47 == *puVar42) {
                      lVar29 = 0;
                      do {
                        puVar48 = (ulong *)((long)puVar22 + lVar29 + 10);
                        if (puVar1 <= puVar48) {
                          puVar47 = (ulong *)(pBVar30 + lVar29 + uVar39 + 8);
                          goto LAB_006df5c1;
                        }
                        lVar15 = lVar29 + uVar39 + 8;
                        lVar29 = lVar29 + 8;
                      } while (*(ulong *)(pBVar30 + lVar15) == *puVar48);
                      uVar36 = *puVar48 ^ *(ulong *)(pBVar30 + lVar15);
                      uVar39 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar29;
                    }
                    else {
                      uVar36 = *puVar42 ^ *puVar47;
                      uVar39 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      uVar39 = uVar39 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_006df5c1:
                    if ((puVar48 < puVar2) && ((int)*puVar47 == (int)*puVar48)) {
                      puVar48 = (ulong *)((long)puVar48 + 4);
                      puVar47 = (ulong *)((long)puVar47 + 4);
                    }
                    if ((puVar48 < puVar3) && ((short)*puVar47 == (short)*puVar48)) {
                      puVar48 = (ulong *)((long)puVar48 + 2);
                      puVar47 = (ulong *)((long)puVar47 + 2);
                    }
                    if (puVar48 < iEnd) {
                      puVar48 = (ulong *)((long)puVar48 + (ulong)((BYTE)*puVar47 == (BYTE)*puVar48))
                      ;
                    }
                    uVar39 = (long)puVar48 - (long)puVar42;
                  }
                  goto LAB_006df607;
                }
              }
              lVar46 = lVar46 + 1;
            } while (lVar46 != lVar37);
          }
          if (uVar41 < 4) break;
          uVar27 = (int)uVar20 + 1;
          uVar40 = 0x1f;
          if (uVar27 != 0) {
            for (; uVar27 >> uVar40 == 0; uVar40 = uVar40 - 1) {
            }
          }
          uVar27 = (int)local_1d0 + 1;
          iVar43 = 0x1f;
          if (uVar27 != 0) {
            for (; uVar27 >> iVar43 == 0; iVar43 = iVar43 + -1) {
            }
          }
          puVar47 = puVar42;
        } while ((int)((uVar40 ^ 0x1f) + (int)uVar38 * 4 + -0x18) < (int)uVar41 * 4 - iVar43);
        psVar16 = local_38;
        if (uVar20 == 0) {
          UVar35 = 1;
        }
        else {
          pBVar32 = (BYTE *)((long)local_168 + (2 - (long)(base_11 + uVar20)));
          pBVar23 = iStart;
          pBVar30 = base_11;
          if ((uint)pBVar32 < uVar8) {
            pBVar23 = pBVar10 + uVar9;
            pBVar30 = pBVar10;
          }
          if ((local_108 < local_168) &&
             (uVar41 = (ulong)pBVar32 & 0xffffffff, pBVar23 < pBVar30 + uVar41)) {
            pBVar30 = pBVar30 + uVar41;
            do {
              pBVar30 = pBVar30 + -1;
              puVar47 = (ulong *)((long)local_168 + -1);
              if ((*(BYTE *)puVar47 != *pBVar30) ||
                 (uVar38 = uVar38 + 1, local_168 = puVar47, puVar47 <= local_108)) break;
            } while (pBVar23 < pBVar30);
          }
          local_134 = local_17c;
          local_17c = (int)uVar20 - 2;
          UVar35 = (int)uVar20 + 1;
        }
        uVar20 = (long)local_168 - (long)local_108;
        puVar47 = (ulong *)local_38->lit;
        if (puVar4 < local_168) {
          puVar42 = puVar47;
          puVar22 = local_108;
          if (local_108 <= puVar4) {
            puVar42 = (ulong *)((long)puVar47 + ((long)puVar4 - (long)local_108));
            uVar41 = local_108[1];
            *puVar47 = *local_108;
            puVar47[1] = uVar41;
            puVar22 = puVar4;
            if (0x10 < (long)puVar4 - (long)local_108) {
              lVar37 = 0x10;
              do {
                uVar14 = *(undefined8 *)((BYTE *)((long)local_108 + lVar37) + 8);
                puVar5 = (undefined8 *)((long)puVar47 + lVar37);
                *puVar5 = *(undefined8 *)((long)local_108 + lVar37);
                puVar5[1] = uVar14;
                pBVar30 = (BYTE *)((long)local_108 + lVar37 + 0x10);
                uVar14 = *(undefined8 *)(pBVar30 + 8);
                puVar5[2] = *(undefined8 *)pBVar30;
                puVar5[3] = uVar14;
                lVar37 = lVar37 + 0x20;
              } while (puVar5 + 4 < puVar42);
            }
          }
          if (puVar22 < local_168) {
            lVar37 = 0;
            do {
              *(BYTE *)((long)puVar42 + lVar37) = *(BYTE *)((long)puVar22 + lVar37);
              lVar37 = lVar37 + 1;
            } while ((long)local_168 - (long)puVar22 != lVar37);
          }
LAB_006dfa67:
          local_38->lit = local_38->lit + uVar20;
          psVar34 = local_38->sequences;
          if (0xffff < uVar20) {
            local_38->longLengthType = ZSTD_llt_literalLength;
            local_38->longLengthPos =
                 (U32)((ulong)((long)psVar34 - (long)local_38->sequencesStart) >> 3);
          }
        }
        else {
          uVar41 = local_108[1];
          *puVar47 = *local_108;
          puVar47[1] = uVar41;
          pBVar30 = local_38->lit;
          if (0x10 < uVar20) {
            uVar41 = local_108[3];
            *(ulong *)(pBVar30 + 0x10) = local_108[2];
            *(ulong *)(pBVar30 + 0x18) = uVar41;
            if (0x20 < (long)uVar20) {
              lVar37 = 0;
              do {
                pBVar32 = (BYTE *)((long)local_108 + lVar37 + 0x20);
                uVar14 = *(undefined8 *)(pBVar32 + 8);
                pBVar23 = pBVar30 + lVar37 + 0x20;
                *(undefined8 *)pBVar23 = *(undefined8 *)pBVar32;
                *(undefined8 *)(pBVar23 + 8) = uVar14;
                pBVar32 = (BYTE *)((long)local_108 + lVar37 + 0x30);
                uVar14 = *(undefined8 *)(pBVar32 + 8);
                *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)pBVar32;
                *(undefined8 *)(pBVar23 + 0x18) = uVar14;
                lVar37 = lVar37 + 0x20;
              } while (pBVar23 + 0x20 < pBVar30 + uVar20);
            }
            goto LAB_006dfa67;
          }
          local_38->lit = pBVar30 + uVar20;
          psVar34 = local_38->sequences;
        }
        psVar34->litLength = (U16)uVar20;
        psVar34->offset = UVar35;
        if (0xffff < uVar38 - 3) {
          local_38->longLengthType = ZSTD_llt_matchLength;
          local_38->longLengthPos =
               (U32)((ulong)((long)psVar34 - (long)local_38->sequencesStart) >> 3);
        }
        psVar34->matchLength = (U16)(uVar38 - 3);
        psVar34 = psVar34 + 1;
        local_38->sequences = psVar34;
        uVar40 = local_17c;
        for (puVar47 = (ulong *)((long)local_168 + uVar38); local_17c = uVar40, local_108 = puVar47,
            puVar47 <= iLimit; puVar47 = (ulong *)((long)puVar47 + sVar21 + 4)) {
          iVar33 = (int)puVar47 - (int)base_11;
          UVar35 = (ms->window).lowLimit;
          UVar26 = iVar33 - uVar17;
          if (iVar33 - UVar35 <= uVar17) {
            UVar26 = UVar35;
          }
          if (ms->loadedDictEnd != 0) {
            UVar26 = UVar35;
          }
          uVar40 = iVar33 - local_134;
          pBVar30 = base_11;
          if (uVar40 < uVar8) {
            pBVar30 = pBVar10;
          }
          if (((iVar18 - uVar40 < 3) || (iVar33 - UVar26 <= local_134)) ||
             ((int)*puVar47 != *(int *)(pBVar30 + uVar40))) break;
          puVar42 = iEnd;
          if (uVar40 < uVar8) {
            puVar42 = puVar19;
          }
          sVar21 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar47 + 4),(BYTE *)((long)(pBVar30 + uVar40) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar42,iStart);
          if (puVar47 <= puVar4) {
            puVar42 = (ulong *)psVar16->lit;
            uVar20 = puVar47[1];
            *puVar42 = *puVar47;
            puVar42[1] = uVar20;
            psVar34 = psVar16->sequences;
          }
          psVar34->litLength = 0;
          psVar34->offset = 1;
          if (0xffff < sVar21 + 1) {
            psVar16->longLengthType = ZSTD_llt_matchLength;
            psVar16->longLengthPos =
                 (U32)((ulong)((long)psVar34 - (long)psVar16->sequencesStart) >> 3);
          }
          psVar34->matchLength = (U16)(sVar21 + 1);
          psVar34 = psVar34 + 1;
          psVar16->sequences = psVar34;
          uVar40 = local_134;
          local_134 = local_17c;
        }
      }
    } while (puVar47 < iLimit);
  }
  *local_40 = local_17c;
  local_40[1] = local_134;
  return (long)iEnd - (long)local_108;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2);
}